

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O1

void __thiscall
embree::SceneGraphFlattener::convertLightsAndCameras
          (SceneGraphFlattener *this,
          vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
          *group,Ref<embree::SceneGraph::Node> *node,Transformations *spaces)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  undefined8 *puVar4;
  float *pfVar5;
  BBox1f *pBVar6;
  size_t *psVar7;
  float fVar8;
  undefined8 uVar9;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar10;
  bool bVar11;
  byte bVar12;
  Node *pNVar13;
  size_t sVar14;
  long lVar15;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar16;
  Ref<embree::SceneGraph::Node> *pRVar17;
  size_type sVar18;
  pointer pcVar19;
  _func_int **pp_Var20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined8 uVar42;
  undefined8 uVar43;
  pointer pRVar44;
  vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
  *this_00;
  undefined4 uVar45;
  long *plVar46;
  long *plVar47;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar48;
  long *plVar49;
  BBox1f this_01;
  AnimatedPerspectiveCameraNode *pAVar50;
  runtime_error *prVar51;
  byte bVar52;
  undefined8 extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong extraout_RDX_07;
  ulong extraout_RDX_08;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  Ref<embree::SceneGraph::Node> *child;
  long lVar53;
  Ref<embree::SceneGraph::Node> *node_00;
  ulong uVar54;
  ulong uVar55;
  uint uVar56;
  int iVar57;
  uint uVar58;
  int iVar59;
  float fVar60;
  undefined1 auVar62 [16];
  undefined1 auVar64 [16];
  undefined1 auVar66 [16];
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  undefined1 auVar115 [16];
  Transformations c;
  vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
  cameras;
  Ref<embree::SceneGraph::PerspectiveCameraNode> cameraNode_1;
  vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
  lights;
  Ref<embree::SceneGraph::AnimatedPerspectiveCameraNode> cameraNode;
  float local_1f8;
  float local_1e8;
  float fStack_1e4;
  undefined1 local_1d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  undefined1 local_1b8 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1a8;
  undefined8 local_198;
  float fStack_190;
  float fStack_18c;
  vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
  local_188;
  Ref<embree::SceneGraph::PerspectiveCameraNode> local_170;
  undefined1 local_168 [32];
  BBox1f local_148;
  long lStack_140;
  vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
  *local_130;
  SceneGraphFlattener *local_128;
  Ref<embree::SceneGraph::AnimatedPerspectiveCameraNode> local_120;
  undefined8 local_118;
  undefined8 uStack_110;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined1 local_b8 [16];
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  string local_90;
  string local_70;
  string local_50;
  undefined1 auVar61 [16];
  undefined1 auVar63 [16];
  undefined1 auVar65 [16];
  
  pNVar13 = node->ptr;
  if (pNVar13->hasLightOrCamera == true) {
    local_128 = this;
    if (pNVar13 == (Node *)0x0) {
      plVar46 = (long *)0x0;
    }
    else {
      plVar46 = (long *)__dynamic_cast(pNVar13,&SceneGraph::Node::typeinfo,
                                       &SceneGraph::TransformNode::typeinfo,0);
    }
    if (plVar46 == (long *)0x0) {
      if (node->ptr == (Node *)0x0) {
        plVar47 = (long *)0x0;
      }
      else {
        plVar47 = (long *)__dynamic_cast(node->ptr,&SceneGraph::Node::typeinfo,
                                         &SceneGraph::GroupNode::typeinfo,0);
      }
      if (plVar47 == (long *)0x0) {
        if (node->ptr == (Node *)0x0) {
          local_198 = (long *)0x0;
        }
        else {
          local_198 = (long *)__dynamic_cast(node->ptr,&SceneGraph::Node::typeinfo,
                                             &SceneGraph::AnimatedLightNode::typeinfo,0);
        }
        if (local_198 == (long *)0x0) {
          if (node->ptr == (Node *)0x0) {
            plVar49 = (long *)0x0;
          }
          else {
            plVar49 = (long *)__dynamic_cast(node->ptr,&SceneGraph::Node::typeinfo,
                                             &SceneGraph::LightNode::typeinfo,0);
          }
          if (plVar49 == (long *)0x0) {
            if (node->ptr == (Node *)0x0) {
              local_120.ptr = (AnimatedPerspectiveCameraNode *)0x0;
            }
            else {
              local_120.ptr =
                   (AnimatedPerspectiveCameraNode *)
                   __dynamic_cast(node->ptr,&SceneGraph::Node::typeinfo,
                                  &SceneGraph::AnimatedPerspectiveCameraNode::typeinfo,0);
            }
            if (local_120.ptr != (AnimatedPerspectiveCameraNode *)0x0) {
              (*((local_120.ptr)->super_PerspectiveCameraNode).super_Node.super_RefCount.
                _vptr_RefCount[2])(local_120.ptr);
            }
            if (local_120.ptr == (AnimatedPerspectiveCameraNode *)0x0) {
              if (node->ptr == (Node *)0x0) {
                local_170.ptr = (PerspectiveCameraNode *)0x0;
              }
              else {
                local_170.ptr =
                     (PerspectiveCameraNode *)
                     __dynamic_cast(node->ptr,&SceneGraph::Node::typeinfo,
                                    &SceneGraph::PerspectiveCameraNode::typeinfo,0);
              }
              if (local_170.ptr != (PerspectiveCameraNode *)0x0) {
                (*((local_170.ptr)->super_Node).super_RefCount._vptr_RefCount[2])(local_170.ptr);
              }
              if (local_170.ptr != (PerspectiveCameraNode *)0x0) {
                sVar18 = (spaces->spaces).size_active;
                if (sVar18 == 1) {
                  pAVar50 = (AnimatedPerspectiveCameraNode *)alignedMalloc(0xb0,0x10);
                  pAVar48 = (spaces->spaces).items;
                  local_1d8._0_8_ = *(undefined8 *)&(pAVar48->l).vx.field_0;
                  local_1d8._8_8_ = *(BBox1f *)((long)&(pAVar48->l).vx.field_0 + 8);
                  local_1c8._M_allocated_capacity = *(undefined8 *)&(pAVar48->l).vy.field_0;
                  local_1c8._8_8_ = *(size_t *)((long)&(pAVar48->l).vy.field_0 + 8);
                  local_1b8._0_8_ = *(undefined8 *)&(pAVar48->l).vz.field_0;
                  local_1b8._8_8_ = *(ulong *)((long)&(pAVar48->l).vz.field_0 + 8);
                  local_1a8.m128[0] = (pAVar48->p).field_0.m128[0];
                  local_1a8.m128[1] = (pAVar48->p).field_0.m128[1];
                  local_1a8.m128[2] = (pAVar48->p).field_0.m128[2];
                  local_1a8.m128[3] = (pAVar48->p).field_0.m128[3];
                  pcVar19 = ((local_170.ptr)->super_Node).name._M_dataplus._M_p;
                  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_70,pcVar19,
                             pcVar19 + ((local_170.ptr)->super_Node).name._M_string_length);
                  makeUniqueID((string *)local_168,local_128,&local_70);
                  SceneGraph::PerspectiveCameraNode::PerspectiveCameraNode
                            ((PerspectiveCameraNode *)pAVar50,&local_170,(AffineSpace3fa *)local_1d8
                             ,(string *)local_168);
                  local_188.
                  super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)pAVar50;
                  (*(pAVar50->super_PerspectiveCameraNode).super_Node.super_RefCount._vptr_RefCount
                    [2])(pAVar50);
                  std::
                  vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
                  ::emplace_back<embree::Ref<embree::SceneGraph::Node>>
                            ((vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
                              *)group,(Ref<embree::SceneGraph::Node> *)&local_188);
                  if ((AnimatedPerspectiveCameraNode *)
                      local_188.
                      super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                      ._M_impl.super__Vector_impl_data._M_start !=
                      (AnimatedPerspectiveCameraNode *)0x0) {
                    (*(((PerspectiveCameraNode *)
                       &(local_188.
                         super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->ptr)->super_Node).
                      super_RefCount._vptr_RefCount[3])();
                  }
                  if ((AnimatedPerspectiveCameraNode *)local_168._0_8_ !=
                      (AnimatedPerspectiveCameraNode *)(local_168 + 0x10)) {
                    operator_delete((void *)local_168._0_8_);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_70._M_dataplus._M_p != &local_70.field_2) {
                    operator_delete(local_70._M_dataplus._M_p);
                  }
                }
                else {
                  std::
                  vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                  ::vector(&local_188,sVar18,(allocator_type *)local_1d8);
                  if ((spaces->spaces).size_active != 0) {
                    lVar53 = 0x30;
                    uVar54 = 0;
                    local_130 = (vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
                                 *)group;
                    do {
                      local_148 = (BBox1f)alignedMalloc(0xb0,0x10);
                      pAVar48 = (spaces->spaces).items;
                      pBVar6 = (BBox1f *)((long)pAVar48 + lVar53 + -0x30);
                      local_1d8._0_8_ = *pBVar6;
                      local_1d8._8_8_ = pBVar6[1];
                      psVar7 = (size_t *)((long)pAVar48 + lVar53 + -0x20);
                      local_1c8._M_allocated_capacity = *psVar7;
                      local_1c8._8_8_ = psVar7[1];
                      puVar4 = (undefined8 *)((long)pAVar48 + lVar53 + -0x10);
                      local_1b8._0_8_ = *puVar4;
                      local_1b8._8_8_ = puVar4[1];
                      pfVar1 = (float *)((long)&(pAVar48->l).vx.field_0 + lVar53);
                      local_1a8.m128[0] = *pfVar1;
                      local_1a8.m128[1] = pfVar1[1];
                      local_1a8.m128[2] = pfVar1[2];
                      local_1a8.m128[3] = pfVar1[3];
                      local_168._0_8_ = (AnimatedPerspectiveCameraNode *)(local_168 + 0x10);
                      std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"");
                      SceneGraph::PerspectiveCameraNode::PerspectiveCameraNode
                                ((PerspectiveCameraNode *)local_148,&local_170,
                                 (AffineSpace3fa *)local_1d8,(string *)local_168);
                      pRVar44 = local_188.
                                super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      (**(code **)(*(_func_int **)local_148 + 0x10))();
                      pp_Var20 = (&(((PerspectiveCameraNode *)&pRVar44->ptr)->super_Node).
                                   super_RefCount._vptr_RefCount)[uVar54];
                      if (pp_Var20 != (_func_int **)0x0) {
                        (**(code **)(*pp_Var20 + 0x18))();
                      }
                      *(BBox1f *)
                       (&(((PerspectiveCameraNode *)&pRVar44->ptr)->super_Node).super_RefCount.
                         _vptr_RefCount + uVar54) = local_148;
                      if ((AnimatedPerspectiveCameraNode *)local_168._0_8_ !=
                          (AnimatedPerspectiveCameraNode *)(local_168 + 0x10)) {
                        operator_delete((void *)local_168._0_8_);
                      }
                      uVar54 = uVar54 + 1;
                      lVar53 = lVar53 + 0x40;
                      group = (vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                               *)local_130;
                    } while (uVar54 < (spaces->spaces).size_active);
                  }
                  pAVar50 = (AnimatedPerspectiveCameraNode *)alignedMalloc(0xd0,0x10);
                  local_148 = spaces->time_range;
                  lStack_140 = 0;
                  pcVar19 = ((local_170.ptr)->super_Node).name._M_dataplus._M_p;
                  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_90,pcVar19,
                             pcVar19 + ((local_170.ptr)->super_Node).name._M_string_length);
                  makeUniqueID((string *)local_1d8,local_128,&local_90);
                  SceneGraph::AnimatedPerspectiveCameraNode::AnimatedPerspectiveCameraNode
                            (pAVar50,&local_188,local_148,(string *)local_1d8);
                  local_168._0_8_ = pAVar50;
                  (*(pAVar50->super_PerspectiveCameraNode).super_Node.super_RefCount._vptr_RefCount
                    [2])(pAVar50);
                  std::
                  vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
                  ::emplace_back<embree::Ref<embree::SceneGraph::Node>>
                            ((vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
                              *)group,(Ref<embree::SceneGraph::Node> *)local_168);
                  if ((AnimatedPerspectiveCameraNode *)local_168._0_8_ !=
                      (AnimatedPerspectiveCameraNode *)0x0) {
                    (**(code **)(*(long *)local_168._0_8_ + 0x18))();
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1d8._0_8_ != &local_1c8) {
                    operator_delete((void *)local_1d8._0_8_);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_90._M_dataplus._M_p != &local_90.field_2) {
                    operator_delete(local_90._M_dataplus._M_p);
                  }
                  std::
                  vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                  ::~vector(&local_188);
                }
              }
              if (local_170.ptr != (PerspectiveCameraNode *)0x0) {
                (*((local_170.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
              }
            }
            else {
              if ((spaces->spaces).size_active != 1) {
                prVar51 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error
                          (prVar51,
                           "animated cameras cannot get instantiated with a transform animation");
                __cxa_throw(prVar51,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              pAVar50 = (AnimatedPerspectiveCameraNode *)alignedMalloc(0xd0,0x10);
              pAVar48 = (spaces->spaces).items;
              local_1d8._0_8_ = *(undefined8 *)&(pAVar48->l).vx.field_0;
              local_1d8._8_8_ = *(BBox1f *)((long)&(pAVar48->l).vx.field_0 + 8);
              local_1c8._M_allocated_capacity = *(undefined8 *)&(pAVar48->l).vy.field_0;
              local_1c8._8_8_ = *(size_t *)((long)&(pAVar48->l).vy.field_0 + 8);
              local_1b8._0_8_ = *(undefined8 *)&(pAVar48->l).vz.field_0;
              local_1b8._8_8_ = *(ulong *)((long)&(pAVar48->l).vz.field_0 + 8);
              local_1a8.m128[0] = (pAVar48->p).field_0.m128[0];
              local_1a8.m128[1] = (pAVar48->p).field_0.m128[1];
              local_1a8.m128[2] = (pAVar48->p).field_0.m128[2];
              local_1a8.m128[3] = (pAVar48->p).field_0.m128[3];
              pcVar19 = ((local_120.ptr)->super_PerspectiveCameraNode).super_Node.name._M_dataplus.
                        _M_p;
              local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_50,pcVar19,
                         pcVar19 + ((local_120.ptr)->super_PerspectiveCameraNode).super_Node.name.
                                   _M_string_length);
              makeUniqueID((string *)local_168,local_128,&local_50);
              SceneGraph::AnimatedPerspectiveCameraNode::AnimatedPerspectiveCameraNode
                        (pAVar50,&local_120,(AffineSpace3fa *)local_1d8,(string *)local_168);
              local_188.
              super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)pAVar50;
              (*(pAVar50->super_PerspectiveCameraNode).super_Node.super_RefCount._vptr_RefCount[2])
                        (pAVar50);
              std::
              vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
              ::emplace_back<embree::Ref<embree::SceneGraph::Node>>
                        ((vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
                          *)group,(Ref<embree::SceneGraph::Node> *)&local_188);
              if ((AnimatedPerspectiveCameraNode *)
                  local_188.
                  super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != (AnimatedPerspectiveCameraNode *)0x0)
              {
                (*(((PerspectiveCameraNode *)
                   &(local_188.
                     super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->ptr)->super_Node).super_RefCount.
                  _vptr_RefCount[3])();
              }
              if ((AnimatedPerspectiveCameraNode *)local_168._0_8_ !=
                  (AnimatedPerspectiveCameraNode *)(local_168 + 0x10)) {
                operator_delete((void *)local_168._0_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p);
              }
            }
            if (local_120.ptr != (AnimatedPerspectiveCameraNode *)0x0) {
              (*((local_120.ptr)->super_PerspectiveCameraNode).super_Node.super_RefCount.
                _vptr_RefCount[3])();
            }
          }
          else {
            (**(code **)(*plVar49 + 0x10))(plVar49);
            sVar18 = (spaces->spaces).size_active;
            if (sVar18 == 1) {
              pAVar48 = (spaces->spaces).items;
              local_1d8._0_8_ = *(undefined8 *)&(pAVar48->l).vx.field_0;
              local_1d8._8_8_ = *(BBox1f *)((long)&(pAVar48->l).vx.field_0 + 8);
              local_1c8._M_allocated_capacity = *(undefined8 *)&(pAVar48->l).vy.field_0;
              local_1c8._8_8_ = *(size_t *)((long)&(pAVar48->l).vy.field_0 + 8);
              local_1b8._0_8_ = *(undefined8 *)&(pAVar48->l).vz.field_0;
              local_1b8._8_8_ = *(ulong *)((long)&(pAVar48->l).vz.field_0 + 8);
              local_1a8.m128[0] = (pAVar48->p).field_0.m128[0];
              local_1a8.m128[1] = (pAVar48->p).field_0.m128[1];
              local_1a8.m128[2] = (pAVar48->p).field_0.m128[2];
              local_1a8.m128[3] = (pAVar48->p).field_0.m128[3];
              (**(code **)(*plVar49 + 0x80))(&local_188);
              local_168._0_8_ =
                   local_188.
                   super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              if ((AnimatedPerspectiveCameraNode *)
                  local_188.
                  super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != (AnimatedPerspectiveCameraNode *)0x0)
              {
                (*(((PerspectiveCameraNode *)
                   &(local_188.
                     super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->ptr)->super_Node).super_RefCount.
                  _vptr_RefCount[2])();
              }
              std::
              vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
              ::emplace_back<embree::Ref<embree::SceneGraph::Node>>
                        ((vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
                          *)group,(Ref<embree::SceneGraph::Node> *)local_168);
              if ((AnimatedPerspectiveCameraNode *)local_168._0_8_ !=
                  (AnimatedPerspectiveCameraNode *)0x0) {
                (**(code **)(*(long *)local_168._0_8_ + 0x18))();
              }
              if ((AnimatedPerspectiveCameraNode *)
                  local_188.
                  super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != (AnimatedPerspectiveCameraNode *)0x0)
              {
                (*(((PerspectiveCameraNode *)
                   &(local_188.
                     super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->ptr)->super_Node).super_RefCount.
                  _vptr_RefCount[3])();
              }
            }
            else {
              local_130 = (vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
                           *)group;
              std::
              vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
              ::vector((vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
                        *)local_168,sVar18,(allocator_type *)local_1d8);
              if ((spaces->spaces).size_active != 0) {
                lVar53 = 0x30;
                uVar54 = 0;
                do {
                  pAVar48 = (spaces->spaces).items;
                  pBVar6 = (BBox1f *)((long)pAVar48 + lVar53 + -0x30);
                  local_1d8._0_8_ = *pBVar6;
                  local_1d8._8_8_ = pBVar6[1];
                  psVar7 = (size_t *)((long)pAVar48 + lVar53 + -0x20);
                  local_1c8._M_allocated_capacity = *psVar7;
                  local_1c8._8_8_ = psVar7[1];
                  puVar4 = (undefined8 *)((long)pAVar48 + lVar53 + -0x10);
                  local_1b8._0_8_ = *puVar4;
                  local_1b8._8_8_ = puVar4[1];
                  pfVar1 = (float *)((long)&(pAVar48->l).vx.field_0 + lVar53);
                  local_1a8.m128[0] = *pfVar1;
                  local_1a8.m128[1] = pfVar1[1];
                  local_1a8.m128[2] = pfVar1[2];
                  local_1a8.m128[3] = pfVar1[3];
                  (**(code **)(*plVar49 + 0x80))(&local_188,plVar49,local_1d8);
                  uVar9 = local_168._0_8_;
                  if (*(long **)(local_168._0_8_ + uVar54 * 8) != (long *)0x0) {
                    (**(code **)(**(long **)(local_168._0_8_ + uVar54 * 8) + 0x18))();
                  }
                  *(pointer *)(uVar9 + uVar54 * 8) =
                       local_188.
                       super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
                  uVar54 = uVar54 + 1;
                  lVar53 = lVar53 + 0x40;
                } while (uVar54 < (spaces->spaces).size_active);
              }
              this_01 = (BBox1f)operator_new(0x88);
              this_00 = local_130;
              SceneGraph::AnimatedLightNode::AnimatedLightNode
                        ((AnimatedLightNode *)this_01,
                         (vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
                          *)local_168,spaces->time_range);
              local_1d8._0_8_ = this_01;
              (**(code **)(*(size_type *)this_01 + 0x10))(this_01);
              std::
              vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
              ::emplace_back<embree::Ref<embree::SceneGraph::Node>>
                        (this_00,(Ref<embree::SceneGraph::Node> *)local_1d8);
              if ((BBox1f)local_1d8._0_8_ != (BBox1f)0x0) {
                (**(code **)(*(size_type *)local_1d8._0_8_ + 0x18))();
              }
              std::
              vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
              ::~vector((vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
                         *)local_168);
            }
          }
          if (plVar49 != (long *)0x0) {
            (**(code **)(*plVar49 + 0x18))();
          }
        }
        else {
          (**(code **)(*local_198 + 0x10))(local_198);
          if ((spaces->spaces).size_active != 1) {
            prVar51 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error
                      (prVar51,"animated lights cannot get instantiated with a transform animation")
            ;
            __cxa_throw(prVar51,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          pAVar48 = (spaces->spaces).items;
          local_1d8._0_8_ = *(undefined8 *)&(pAVar48->l).vx.field_0;
          local_1d8._8_8_ = *(BBox1f *)((long)&(pAVar48->l).vx.field_0 + 8);
          local_1c8._M_allocated_capacity = *(undefined8 *)&(pAVar48->l).vy.field_0;
          local_1c8._8_8_ = *(size_t *)((long)&(pAVar48->l).vy.field_0 + 8);
          local_1b8._0_8_ = *(undefined8 *)&(pAVar48->l).vz.field_0;
          local_1b8._8_8_ = *(ulong *)((long)&(pAVar48->l).vz.field_0 + 8);
          local_1a8.m128[0] = (pAVar48->p).field_0.m128[0];
          local_1a8.m128[1] = (pAVar48->p).field_0.m128[1];
          local_1a8.m128[2] = (pAVar48->p).field_0.m128[2];
          local_1a8.m128[3] = (pAVar48->p).field_0.m128[3];
          (**(code **)(*local_198 + 0x80))(&local_188,local_198);
          local_168._0_8_ =
               local_188.
               super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          if ((AnimatedPerspectiveCameraNode *)
              local_188.
              super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (AnimatedPerspectiveCameraNode *)0x0) {
            (*(((PerspectiveCameraNode *)
               &(local_188.
                 super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->ptr)->super_Node).super_RefCount.
              _vptr_RefCount[2])();
          }
          std::
          vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
          ::emplace_back<embree::Ref<embree::SceneGraph::Node>>
                    ((vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
                      *)group,(Ref<embree::SceneGraph::Node> *)local_168);
          if ((AnimatedPerspectiveCameraNode *)local_168._0_8_ !=
              (AnimatedPerspectiveCameraNode *)0x0) {
            (**(code **)(*(long *)local_168._0_8_ + 0x18))();
          }
          if ((AnimatedPerspectiveCameraNode *)
              local_188.
              super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (AnimatedPerspectiveCameraNode *)0x0) {
            (*(((PerspectiveCameraNode *)
               &(local_188.
                 super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->ptr)->super_Node).super_RefCount.
              _vptr_RefCount[3])();
          }
        }
        if (local_198 != (long *)0x0) {
          (**(code **)(*local_198 + 0x18))();
        }
      }
      else {
        (**(code **)(*plVar47 + 0x10))(plVar47);
        pRVar17 = (Ref<embree::SceneGraph::Node> *)plVar47[0xe];
        for (node_00 = (Ref<embree::SceneGraph::Node> *)plVar47[0xd]; node_00 != pRVar17;
            node_00 = node_00 + 1) {
          convertLightsAndCameras(local_128,group,node_00,spaces);
        }
      }
      if (plVar47 != (long *)0x0) {
        (**(code **)(*plVar47 + 0x18))();
      }
    }
    else {
      auVar115 = (**(code **)(*plVar46 + 0x10))(plVar46);
      uVar54 = auVar115._8_8_;
      sVar14 = (spaces->spaces).size_active;
      if (sVar14 == 1) {
        fVar60 = (spaces->time_range).lower;
        fVar79 = (spaces->time_range).upper;
        fVar88 = (float)plVar46[0xd];
        fVar103 = (float)((ulong)plVar46[0xd] >> 0x20);
        uVar56 = -(uint)(fVar60 < fVar88);
        uVar58 = -(uint)(fVar79 < fVar103);
        sVar14 = plVar46[0xf];
        local_1d8._4_4_ = ~uVar58 & (uint)fVar103 | (uint)fVar79 & uVar58;
        local_1d8._0_4_ = ~uVar56 & (uint)fVar60 | (uint)fVar88 & uVar56;
        local_1c8._M_allocated_capacity = 0;
        local_1c8._8_8_ = 0;
        local_1b8._0_8_ = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
        local_130 = (vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
                     *)group;
        if (sVar14 != 0) {
          local_1b8._0_8_ = alignedMalloc(sVar14 << 6,0x10);
          auVar115._8_8_ = extraout_RDX;
          auVar115._0_8_ = local_1b8._0_8_;
          local_1c8._8_8_ = sVar14;
        }
        local_1b8._8_8_ = local_1b8._8_8_ & 0xffffffffffffff00;
        local_1c8._0_8_ = local_1c8._8_8_;
        if (plVar46[0xf] != 0) {
          lVar53 = 0x30;
          uVar54 = 0;
          do {
            uVar42 = local_1b8._8_8_;
            uVar56 = auVar115._8_4_;
            pAVar48 = (spaces->spaces).items;
            lVar15 = plVar46[0x11];
            bVar11 = spaces->quaternion;
            bVar12 = *(byte *)(plVar46 + 0x12);
            local_1b8._8_8_ = local_1b8._8_8_ & 0xffffffffffffff00;
            uVar43 = local_1b8._8_8_;
            fVar60 = (pAVar48->l).vx.field_0.m128[0];
            uVar9 = *(undefined8 *)((long)&(pAVar48->l).vx.field_0 + 4);
            fVar79 = (float)((ulong)uVar9 >> 0x20);
            local_1f8 = (float)uVar9;
            local_1b8._9_7_ = SUB87(uVar42,1);
            if ((((fVar60 != 1.0) || (NAN(fVar60))) || (local_1f8 != 0.0)) ||
               (((NAN(local_1f8) || (fVar79 != 0.0)) || (NAN(fVar79))))) {
LAB_0015e402:
              uVar9 = *(undefined8 *)(lVar15 + -0x30 + lVar53);
              fVar88 = (float)uVar9;
              fVar103 = (float)((ulong)uVar9 >> 0x20);
              iVar57 = -(uint)(fVar88 != 1.0);
              iVar59 = -(uint)(fVar103 != 0.0);
              auVar62._4_4_ = iVar59;
              auVar62._0_4_ = iVar57;
              auVar62._8_4_ = iVar59;
              auVar62._12_4_ = iVar59;
              auVar61._8_8_ = auVar62._8_8_;
              auVar61._4_4_ = iVar57;
              auVar61._0_4_ = iVar57;
              uVar56 = movmskpd(uVar56,auVar61);
              uVar55 = (ulong)uVar56;
              fVar60 = *(float *)(lVar15 + -0x28 + lVar53);
              if ((uVar56 & 1) == 0) {
                bVar52 = (byte)uVar56 >> 1;
                uVar56 = CONCAT31((int3)(uVar56 >> 8),bVar52);
                uVar55 = (ulong)uVar56;
                if (((bVar52 == 0) && (fVar60 == 0.0)) && (!NAN(fVar60))) {
                  pfVar1 = (float *)(lVar15 + -0x24 + lVar53);
                  auVar33._4_4_ = -(uint)(pfVar1[1] != 0.0);
                  auVar33._0_4_ = -(uint)(*pfVar1 != 0.0);
                  auVar33._8_4_ = -(uint)(pfVar1[2] != 1.0);
                  auVar33._12_4_ = -(uint)(pfVar1[3] != 0.0);
                  uVar56 = movmskps(uVar56,auVar33);
                  uVar55 = (ulong)uVar56;
                  if ((((bVar12 & (byte)uVar56) == 0) && ((uVar56 & 2) == 0)) && ((uVar56 & 4) == 0)
                     ) {
                    bVar52 = ((byte)uVar56 & 8) >> 3;
                    uVar56 = CONCAT31((int3)(uVar56 >> 8),bVar52);
                    uVar55 = (ulong)uVar56;
                    if (bVar52 == 0) {
                      pfVar1 = (float *)(lVar15 + -0x14 + lVar53);
                      auVar34._4_4_ = -(uint)(pfVar1[1] != 0.0);
                      auVar34._0_4_ = -(uint)(*pfVar1 != 0.0);
                      auVar34._8_4_ = -(uint)(pfVar1[2] != 0.0);
                      auVar34._12_4_ = -(uint)(pfVar1[3] != 1.0);
                      uVar56 = movmskps(uVar56,auVar34);
                      uVar55 = (ulong)uVar56;
                      if ((((bVar12 & (byte)uVar56) == 0) && ((uVar56 & 2) == 0)) &&
                         ((uVar56 & 4) == 0)) {
                        bVar52 = ((byte)uVar56 & 8) >> 3;
                        uVar56 = CONCAT31((int3)(uVar56 >> 8),bVar52);
                        uVar55 = (ulong)uVar56;
                        if (bVar52 == 0) {
                          pfVar1 = (float *)(lVar15 + -4 + lVar53);
                          auVar35._4_4_ = -(uint)(pfVar1[1] != 0.0);
                          auVar35._0_4_ = -(uint)(*pfVar1 != 0.0);
                          auVar35._8_4_ = -(uint)(pfVar1[2] != 0.0);
                          auVar35._12_4_ = -(uint)(pfVar1[3] != 0.0);
                          uVar56 = movmskps(uVar56,auVar35);
                          uVar55 = (ulong)uVar56;
                          if ((((((bVar12 & (byte)uVar56) == 0) && ((uVar56 & 2) == 0)) &&
                               ((uVar56 & 4) == 0)) &&
                              (bVar52 = ((byte)uVar56 & 8) >> 3,
                              uVar55 = (ulong)CONCAT31((int3)(uVar56 >> 8),bVar52), bVar52 == 0)) &&
                             ((bVar12 == 0 ||
                              ((fVar98 = *(float *)(lVar15 + 0xc + lVar53), fVar98 == 1.0 &&
                               (!NAN(fVar98))))))) {
                            local_1b8[8] = bVar11;
                            fVar76 = (pAVar48->l).vx.field_0.m128[0];
                            local_1f8 = (pAVar48->l).vx.field_0.m128[1];
                            fVar79 = (pAVar48->l).vx.field_0.m128[2];
                            fVar60 = (pAVar48->l).vx.field_0.m128[3];
                            fVar88 = (pAVar48->l).vy.field_0.m128[0];
                            fVar74 = (pAVar48->l).vy.field_0.m128[1];
                            fVar96 = (pAVar48->l).vy.field_0.m128[2];
                            fVar98 = (pAVar48->l).vy.field_0.m128[3];
                            fVar80 = (pAVar48->l).vz.field_0.m128[0];
                            fVar82 = (pAVar48->l).vz.field_0.m128[1];
                            fVar84 = (pAVar48->l).vz.field_0.m128[2];
                            fVar75 = (pAVar48->l).vz.field_0.m128[3];
                            fVar103 = (pAVar48->p).field_0.m128[0];
                            fVar83 = (pAVar48->p).field_0.m128[1];
                            fVar67 = (pAVar48->p).field_0.m128[2];
                            fVar86 = (pAVar48->p).field_0.m128[3];
                            goto LAB_0015eede;
                          }
                        }
                      }
                    }
                  }
                }
              }
              local_1b8._8_8_ = uVar43;
              if ((bVar11 == false) && (bVar12 == 0)) {
                fVar113 = (pAVar48->l).vx.field_0.m128[0];
                fVar68 = (pAVar48->l).vx.field_0.m128[1];
                fVar69 = (pAVar48->l).vx.field_0.m128[2];
                fVar70 = (pAVar48->l).vx.field_0.m128[3];
                fVar71 = (pAVar48->l).vy.field_0.m128[0];
                fVar72 = (pAVar48->l).vy.field_0.m128[1];
                fVar73 = (pAVar48->l).vy.field_0.m128[2];
                fVar77 = (pAVar48->l).vy.field_0.m128[3];
                fVar78 = (pAVar48->l).vz.field_0.m128[0];
                fVar111 = (pAVar48->l).vz.field_0.m128[1];
                fVar81 = (pAVar48->l).vz.field_0.m128[2];
                fVar112 = (pAVar48->l).vz.field_0.m128[3];
                fVar76 = fVar88 * fVar113 + fVar103 * fVar71 + fVar60 * fVar78;
                local_1f8 = fVar88 * fVar68 + fVar103 * fVar72 + fVar60 * fVar111;
                fVar79 = fVar88 * fVar69 + fVar103 * fVar73 + fVar60 * fVar81;
                fVar74 = *(float *)(lVar15 + -0x20 + lVar53);
                fVar8 = *(float *)(lVar15 + -0x1c + lVar53);
                fVar104 = *(float *)(lVar15 + -0x18 + lVar53);
                fVar75 = *(float *)(lVar15 + -0x10 + lVar53);
                fVar96 = fVar74 * fVar69 + fVar8 * fVar73 + fVar104 * fVar81;
                fVar98 = fVar74 * fVar70 + fVar8 * fVar77 + fVar104 * fVar112;
                fVar83 = *(float *)(lVar15 + -0xc + lVar53);
                fVar67 = *(float *)(lVar15 + -8 + lVar53);
                fVar80 = fVar75 * fVar113 + fVar83 * fVar71 + fVar67 * fVar78;
                fVar82 = fVar75 * fVar68 + fVar83 * fVar72 + fVar67 * fVar111;
                fVar84 = fVar75 * fVar69 + fVar83 * fVar73 + fVar67 * fVar81;
                fVar86 = *(float *)(lVar15 + lVar53);
                fVar105 = *(float *)(lVar15 + 4 + lVar53);
                fVar110 = *(float *)(lVar15 + 8 + lVar53);
                fVar75 = fVar75 * fVar70 + fVar83 * fVar77 + fVar67 * fVar112;
                fVar60 = fVar88 * fVar70 + fVar103 * fVar77 + fVar60 * fVar112;
                fVar103 = fVar86 * fVar113 + fVar105 * fVar71 + fVar110 * fVar78 +
                          (pAVar48->p).field_0.m128[0];
                fVar83 = fVar86 * fVar68 + fVar105 * fVar72 + fVar110 * fVar111 +
                         (pAVar48->p).field_0.m128[1];
                fVar67 = fVar86 * fVar69 + fVar105 * fVar73 + fVar110 * fVar81 +
                         (pAVar48->p).field_0.m128[2];
                fVar86 = fVar86 * fVar70 + fVar105 * fVar77 + fVar110 * fVar112 +
                         (pAVar48->p).field_0.m128[3];
                fVar88 = fVar74 * fVar113 + fVar8 * fVar71 + fVar104 * fVar78;
                fVar74 = fVar74 * fVar68 + fVar8 * fVar72 + fVar104 * fVar111;
              }
              else if ((bVar11 == false) || (bVar12 == 0)) {
                if ((bVar11 == false) || (bVar12 != 0)) {
                  if ((local_1f8 != 0.0) ||
                     ((((NAN(local_1f8) || (fVar79 != 0.0)) || (NAN(fVar79))) ||
                      (uVar9 = *(undefined8 *)&(pAVar48->l).vz.field_0,
                      auVar24._4_4_ = -(uint)((pAVar48->l).vy.field_0.m128[0] != 0.0),
                      auVar24._0_4_ = -(uint)((pAVar48->l).vy.field_0.m128[2] != 0.0),
                      auVar24._8_4_ = -(uint)((float)uVar9 != 0.0),
                      auVar24._12_4_ = -(uint)((float)((ulong)uVar9 >> 0x20) != 0.0),
                      uVar45 = movmskps((int)CONCAT71(auVar115._1_7_,bVar12),auVar24),
                      (char)uVar45 != '\0')))) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,
                               "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                               ,0x83);
                    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
                    std::ostream::put(' ');
                    std::ostream::flush();
                    uVar55 = extraout_RDX_02;
                  }
                  pfVar2 = (float *)(lVar15 + -0x30 + lVar53);
                  fVar60 = pfVar2[3];
                  pfVar3 = (float *)(lVar15 + -0x20 + lVar53);
                  fVar88 = *pfVar3;
                  fVar98 = pfVar3[3];
                  pfVar5 = (float *)(lVar15 + -0x10 + lVar53);
                  fVar80 = *pfVar5;
                  fVar82 = pfVar5[1];
                  fVar75 = pfVar5[3];
                  pfVar1 = (float *)(lVar15 + lVar53);
                  fVar103 = *pfVar1;
                  fVar83 = pfVar1[1];
                  fVar67 = pfVar1[2];
                  fVar86 = pfVar1[3];
                  uVar9 = *(undefined8 *)&(pAVar48->p).field_0;
                  fVar76 = (pAVar48->l).vx.field_0.m128[0] * *pfVar2;
                  local_1f8 = pfVar2[1] + (float)uVar9;
                  fVar79 = pfVar2[2] + (float)((ulong)uVar9 >> 0x20);
                  fVar96 = pfVar3[2] + (pAVar48->p).field_0.m128[2];
                  fVar74 = pfVar3[1] * (pAVar48->l).vy.field_0.m128[1];
                  fVar84 = pfVar5[2] * (pAVar48->l).vz.field_0.m128[2];
                  local_1b8[8] = 1;
                }
                else {
                  local_d8 = ZEXT416((uint)(pAVar48->p).field_0.m128[3]);
                  local_b8 = ZEXT416((uint)(pAVar48->l).vx.field_0.m128[3]);
                  local_e8 = ZEXT416((uint)(pAVar48->l).vz.field_0.m128[3]);
                  local_f8 = (pAVar48->l).vy.field_0.m128[0];
                  fStack_f4 = (pAVar48->l).vy.field_0.m128[1];
                  fStack_ec = (pAVar48->l).vy.field_0.m128[3];
                  local_108 = (pAVar48->l).vz.field_0.m128[0];
                  fStack_104 = (pAVar48->l).vz.field_0.m128[1];
                  fStack_100 = (pAVar48->l).vz.field_0.m128[2];
                  fStack_fc = (pAVar48->l).vz.field_0.m128[3];
                  local_c8 = *(undefined8 *)((long)&(pAVar48->l).vy.field_0 + 8);
                  uStack_c0 = 0;
                  local_148.lower = (pAVar48->l).vx.field_0.m128[0];
                  fVar60 = (pAVar48->l).vx.field_0.m128[1];
                  pfVar1 = (float *)(lVar15 + -0x30 + lVar53);
                  fVar88 = *pfVar1;
                  fVar103 = pfVar1[1];
                  fVar98 = pfVar1[2];
                  pfVar1 = (float *)(lVar15 + -0x20 + lVar53);
                  fVar80 = *pfVar1;
                  fVar82 = pfVar1[1];
                  fVar75 = pfVar1[2];
                  puVar4 = (undefined8 *)(lVar15 + -0x10 + lVar53);
                  local_118 = *puVar4;
                  uStack_110 = puVar4[1];
                  pfVar1 = (float *)(lVar15 + lVar53);
                  fVar83 = *pfVar1;
                  fVar67 = pfVar1[1];
                  fVar86 = pfVar1[2];
                  fVar76 = fVar88 * local_148.lower + fVar103 * local_f8 + fVar98 * local_108;
                  fVar74 = fVar88 * 0.0 + fVar103 * fStack_f4 + fVar98 * fStack_104;
                  fVar88 = fVar88 * 0.0 + fVar103 * 0.0 + fVar98 * fStack_100;
                  fStack_190 = fVar80 * 0.0 + fVar82 * 0.0 + fVar75 * fStack_100;
                  fStack_18c = fVar80 * fVar60 + fVar82 * fStack_ec + fVar75 * fStack_fc;
                  local_198 = (long *)CONCAT44(fVar80 * 0.0 +
                                               fVar82 * fStack_f4 + fVar75 * fStack_104,
                                               fVar80 * local_148.lower +
                                               fVar82 * local_f8 + fVar75 * local_108);
                  fStack_f0 = 0.0;
                  local_148.upper = 0.0;
                  lStack_140 = (ulong)(uint)fVar60 << 0x20;
                  local_a8 = fVar83 * local_148.lower + fVar67 * local_f8 + fVar86 * local_108 +
                             (pAVar48->p).field_0.m128[0];
                  fStack_a4 = fVar83 * 0.0 + fVar67 * fStack_f4 + fVar86 * fStack_104 +
                              (pAVar48->p).field_0.m128[1];
                  fStack_a0 = fVar83 * 0.0 + fVar67 * 0.0 + fVar86 * fStack_100 +
                              (pAVar48->p).field_0.m128[2];
                  fStack_9c = fVar83 * fVar60 + fVar67 * fStack_ec + fVar86 * fStack_fc +
                              (pAVar48->p).field_0.m128[3];
                  if ((((fVar74 != 0.0) || (NAN(fVar74))) ||
                      ((fVar88 != 0.0 || ((NAN(fVar88) || (fStack_190 != 0.0)))))) ||
                     (NAN(fStack_190))) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,
                               "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                               ,0x61);
                    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
                    std::ostream::put(' ');
                    std::ostream::flush();
                    uVar55 = extraout_RDX_01;
                  }
                  fVar80 = local_148.lower * (float)local_118 +
                           local_f8 * local_118._4_4_ + local_108 * (float)uStack_110;
                  fVar82 = local_148.upper * (float)local_118 +
                           fStack_f4 * local_118._4_4_ + fStack_104 * (float)uStack_110;
                  fVar84 = (float)lStack_140 * (float)local_118 +
                           fStack_f0 * local_118._4_4_ + fStack_100 * (float)uStack_110;
                  local_1b8[8] = 1;
                  fVar96 = (float)local_c8;
                  fVar98 = (float)((ulong)local_c8 >> 0x20);
                  fVar75 = (float)local_e8._0_4_;
                  fVar60 = (float)local_b8._0_4_;
                  fVar103 = local_a8;
                  fVar83 = fStack_a4;
                  fVar67 = fStack_a0;
                  fVar86 = (float)local_d8._0_4_;
                  fVar88 = (float)local_198;
                  fVar74 = local_198._4_4_;
                }
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                           ,0x67);
                std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
                std::ostream::put(' ');
                std::ostream::flush();
                fVar60 = (pAVar48->p).field_0.m128[3];
                fVar79 = (pAVar48->l).vx.field_0.m128[3];
                fVar88 = (pAVar48->l).vy.field_0.m128[3];
                fVar103 = (pAVar48->l).vz.field_0.m128[3];
                aVar10 = (pAVar48->l).vx.field_0.field_1;
                fVar98 = (pAVar48->l).vy.field_0.m128[0];
                fVar80 = (pAVar48->l).vy.field_0.m128[1];
                fVar82 = (pAVar48->l).vz.field_0.m128[0];
                fVar75 = (pAVar48->l).vz.field_0.m128[1];
                fVar83 = (pAVar48->l).vz.field_0.m128[2];
                fVar105 = fVar79 * fVar88 + fVar60 * fVar103;
                fVar76 = fVar79 * fVar88 - fVar60 * fVar103;
                fVar96 = fVar60 * fVar60 + fVar79 * fVar79 + -fVar88 * fVar88 + -fVar103 * fVar103;
                fVar84 = fVar60 * fVar60 - fVar79 * fVar79;
                fVar104 = fVar88 * fVar88 + fVar84 + -fVar103 * fVar103;
                fVar113 = fVar79 * fVar103 - fVar60 * fVar88;
                fVar67 = fVar60 * fVar88 + fVar79 * fVar103;
                fVar110 = fVar88 * fVar103 + fVar60 * fVar79;
                fVar60 = fVar88 * fVar103 - fVar60 * fVar79;
                fVar86 = (pAVar48->p).field_0.m128[0];
                fVar74 = (pAVar48->p).field_0.m128[1];
                fVar8 = (pAVar48->p).field_0.m128[2];
                fVar105 = fVar105 + fVar105;
                fVar113 = fVar113 + fVar113;
                fVar76 = fVar76 + fVar76;
                fVar110 = fVar110 + fVar110;
                fVar67 = fVar67 + fVar67;
                fVar60 = fVar60 + fVar60;
                fVar79 = fVar103 * fVar103 + fVar84 + -fVar88 * fVar88;
                fVar92 = fVar96 * 1.0 + fVar105 * 0.0 + fVar113 * 0.0;
                fVar94 = fVar96 * 0.0 + fVar105 * 1.0 + fVar113 * 0.0;
                fVar97 = fVar96 * 0.0 + fVar105 * 0.0 + fVar113 * 1.0;
                fVar99 = fVar96 * 0.0 + fVar105 * 0.0 + fVar113 * 0.0;
                fVar87 = fVar76 * 1.0 + fVar104 * 0.0 + fVar110 * 0.0;
                fVar89 = fVar76 * 0.0 + fVar104 * 1.0 + fVar110 * 0.0;
                fVar90 = fVar76 * 0.0 + fVar104 * 0.0 + fVar110 * 1.0;
                fVar91 = fVar76 * 0.0 + fVar104 * 0.0 + fVar110 * 0.0;
                fVar110 = fVar67 * 1.0 + fVar60 * 0.0 + fVar79 * 0.0;
                fVar68 = fVar67 * 0.0 + fVar60 * 1.0 + fVar79 * 0.0;
                fVar70 = fVar67 * 0.0 + fVar60 * 0.0 + fVar79 * 1.0;
                fVar72 = fVar67 * 0.0 + fVar60 * 0.0 + fVar79 * 0.0;
                local_1e8 = aVar10.y;
                fStack_1e4 = aVar10.z;
                local_1f8 = aVar10.x;
                fVar106 = local_1f8 * fVar92 + fVar87 * 0.0 + fVar110 * 0.0;
                fVar107 = local_1f8 * fVar94 + fVar89 * 0.0 + fVar68 * 0.0;
                fVar108 = local_1f8 * fVar97 + fVar90 * 0.0 + fVar70 * 0.0;
                fVar109 = local_1f8 * fVar99 + fVar91 * 0.0 + fVar72 * 0.0;
                fVar113 = fVar98 * fVar92 + fVar80 * fVar87 + fVar110 * 0.0;
                fVar69 = fVar98 * fVar94 + fVar80 * fVar89 + fVar68 * 0.0;
                fVar71 = fVar98 * fVar97 + fVar80 * fVar90 + fVar70 * 0.0;
                fVar73 = fVar98 * fVar99 + fVar80 * fVar91 + fVar72 * 0.0;
                fVar104 = fVar82 * fVar92 + fVar75 * fVar87 + fVar83 * fVar110;
                fVar105 = fVar82 * fVar94 + fVar75 * fVar89 + fVar83 * fVar68;
                fStack_190 = fVar82 * fVar97 + fVar75 * fVar90 + fVar83 * fVar70;
                fStack_18c = fVar82 * fVar99 + fVar75 * fVar91 + fVar83 * fVar72;
                local_198 = (long *)CONCAT44(fVar105,fVar104);
                fVar60 = *(float *)(lVar15 + 0xc + lVar53);
                fVar79 = *(float *)(lVar15 + -0x24 + lVar53);
                fVar88 = *(float *)(lVar15 + -0x14 + lVar53);
                fVar103 = *(float *)(lVar15 + -4 + lVar53);
                fVar84 = fVar79 * fVar88 + fVar60 * fVar103;
                fVar76 = fVar79 * fVar88 - fVar60 * fVar103;
                fVar96 = fVar60 * fVar60 + fVar79 * fVar79 + -fVar88 * fVar88 + -fVar103 * fVar103;
                fVar80 = fVar60 * fVar60 - fVar79 * fVar79;
                fVar112 = fVar88 * fVar88 + fVar80 + -fVar103 * fVar103;
                fVar111 = fVar79 * fVar103 - fVar60 * fVar88;
                fVar81 = fVar60 * fVar88 + fVar79 * fVar103;
                fVar114 = fVar88 * fVar103 + fVar60 * fVar79;
                fVar67 = fVar88 * fVar103 - fVar60 * fVar79;
                pfVar2 = (float *)(lVar15 + -0x30 + lVar53);
                fVar60 = *pfVar2;
                pfVar3 = (float *)(lVar15 + -0x20 + lVar53);
                fVar79 = *pfVar3;
                fVar98 = pfVar3[1];
                fVar100 = fVar103 * fVar103 + fVar80 + -fVar88 * fVar88;
                pfVar1 = (float *)(lVar15 + -0x10 + lVar53);
                fVar88 = *pfVar1;
                fVar103 = pfVar1[1];
                fVar80 = pfVar1[2];
                fVar84 = fVar84 + fVar84;
                fVar111 = fVar111 + fVar111;
                pfVar1 = (float *)(lVar15 + lVar53);
                fVar82 = *pfVar1;
                fVar75 = pfVar1[1];
                fVar83 = pfVar1[2];
                fVar77 = fVar96 * 1.0 + fVar84 * 0.0 + fVar111 * 0.0;
                fVar78 = fVar96 * 0.0 + fVar84 * 1.0 + fVar111 * 0.0;
                fVar111 = fVar96 * 0.0 + fVar84 * 0.0 + fVar111 * 1.0;
                fVar76 = fVar76 + fVar76;
                fVar114 = fVar114 + fVar114;
                fVar81 = fVar81 + fVar81;
                fVar67 = fVar67 + fVar67;
                fVar96 = fVar76 * 1.0 + fVar112 * 0.0 + fVar114 * 0.0;
                fVar84 = fVar76 * 0.0 + fVar112 * 1.0 + fVar114 * 0.0;
                fVar76 = fVar76 * 0.0 + fVar112 * 0.0 + fVar114 * 1.0;
                fVar112 = fVar81 * 1.0 + fVar67 * 0.0 + fVar100 * 0.0;
                fVar114 = fVar81 * 0.0 + fVar67 * 1.0 + fVar100 * 0.0;
                fVar67 = fVar81 * 0.0 + fVar67 * 0.0 + fVar100 * 1.0;
                fVar93 = fVar60 * fVar77 + fVar96 * 0.0 + fVar112 * 0.0;
                fVar95 = fVar60 * fVar78 + fVar84 * 0.0 + fVar114 * 0.0;
                fVar60 = fVar60 * fVar111 + fVar76 * 0.0 + fVar67 * 0.0;
                fVar81 = fVar79 * fVar77 + fVar98 * fVar96 + fVar112 * 0.0;
                fVar100 = fVar79 * fVar78 + fVar98 * fVar84 + fVar114 * 0.0;
                fVar85 = fVar79 * fVar111 + fVar98 * fVar76 + fVar67 * 0.0;
                fVar101 = fVar88 * fVar77 + fVar103 * fVar96 + fVar80 * fVar112;
                fVar102 = fVar88 * fVar78 + fVar103 * fVar84 + fVar80 * fVar114;
                fVar103 = fVar88 * fVar111 + fVar103 * fVar76 + fVar80 * fVar67;
                fVar88 = fVar82 * fVar77 + fVar75 * fVar96 + fVar83 * fVar112 + pfVar2[1] + 0.0;
                fVar77 = fVar82 * fVar78 + fVar75 * fVar84 + fVar83 * fVar114 + pfVar2[2] + 0.0;
                fVar78 = fVar82 * fVar111 + fVar75 * fVar76 + fVar83 * fVar67 + pfVar3[2] + 0.0;
                fVar76 = fVar93 * fVar106 + fVar95 * fVar113 + fVar60 * fVar104;
                local_1f8 = fVar93 * fVar107 + fVar95 * fVar69 + fVar60 * fVar105;
                fVar79 = fVar93 * fVar108 + fVar95 * fVar71 + fVar60 * fStack_190;
                fVar96 = fVar81 * fVar108 + fVar100 * fVar71 + fVar85 * fStack_190;
                fVar98 = fVar81 * fVar109 + fVar100 * fVar73 + fVar85 * fStack_18c;
                fVar80 = fVar101 * fVar106 + fVar102 * fVar113 + fVar103 * fVar104;
                fVar82 = fVar101 * fVar107 + fVar102 * fVar69 + fVar103 * fVar105;
                fVar84 = fVar101 * fVar108 + fVar102 * fVar71 + fVar103 * fStack_190;
                uVar55 = extraout_RDX_00;
                fVar75 = fVar101 * fVar109 + fVar102 * fVar73 + fVar103 * fStack_18c;
                fVar60 = fVar93 * fVar109 + fVar95 * fVar73 + fVar60 * fStack_18c;
                fVar103 = fVar88 * fVar106 + fVar77 * fVar113 + fVar78 * fVar104 +
                          fVar86 * fVar92 + fVar74 * fVar87 + fVar8 * fVar110 + local_1e8 + 0.0;
                fVar83 = fVar88 * fVar107 + fVar77 * fVar69 + fVar78 * fVar105 +
                         fVar86 * fVar94 + fVar74 * fVar89 + fVar8 * fVar68 + fStack_1e4 + 0.0;
                fVar67 = fVar88 * fVar108 + fVar77 * fVar71 + fVar78 * fStack_190 +
                         fVar86 * fVar97 + fVar74 * fVar90 + fVar8 * fVar70 +
                         (pAVar48->l).vy.field_0.m128[2] + 0.0;
                fVar86 = fVar88 * fVar109 + fVar77 * fVar73 + fVar78 * fStack_18c +
                         fVar86 * fVar99 + fVar74 * fVar91 + fVar8 * fVar72 + 0.0;
                fVar88 = fVar81 * fVar106 + fVar100 * fVar113 + fVar85 * fVar104;
                fVar74 = fVar81 * fVar107 + fVar100 * fVar69 + fVar85 * fVar105;
              }
            }
            else {
              auVar21._4_4_ = -(uint)((pAVar48->l).vy.field_0.m128[0] != 0.0);
              auVar21._0_4_ = -(uint)((pAVar48->l).vx.field_0.m128[3] != 0.0);
              auVar21._8_4_ = -(uint)((pAVar48->l).vy.field_0.m128[1] != 1.0);
              auVar21._12_4_ = -(uint)((pAVar48->l).vy.field_0.m128[2] != 0.0);
              uVar56 = movmskps(uVar56,auVar21);
              if ((((bVar11 & (byte)uVar56) != 0) || ((uVar56 & 2) != 0)) ||
                 (((uVar56 & 4) != 0 ||
                  (bVar52 = ((byte)uVar56 & 8) >> 3, uVar56 = CONCAT31((int3)(uVar56 >> 8),bVar52),
                  bVar52 != 0)))) goto LAB_0015e402;
              auVar22._4_4_ = -(uint)((pAVar48->l).vz.field_0.m128[0] != 0.0);
              auVar22._0_4_ = -(uint)((pAVar48->l).vy.field_0.m128[3] != 0.0);
              auVar22._8_4_ = -(uint)((pAVar48->l).vz.field_0.m128[1] != 0.0);
              auVar22._12_4_ = -(uint)((pAVar48->l).vz.field_0.m128[2] != 1.0);
              uVar56 = movmskps(uVar56,auVar22);
              if (((((bVar11 & (byte)uVar56) != 0) || ((uVar56 & 2) != 0)) || ((uVar56 & 4) != 0))
                 || (bVar52 = ((byte)uVar56 & 8) >> 3, uVar56 = CONCAT31((int3)(uVar56 >> 8),bVar52)
                    , bVar52 != 0)) goto LAB_0015e402;
              auVar23._4_4_ = -(uint)((pAVar48->p).field_0.m128[0] != 0.0);
              auVar23._0_4_ = -(uint)((pAVar48->l).vz.field_0.m128[3] != 0.0);
              auVar23._8_4_ = -(uint)((pAVar48->p).field_0.m128[1] != 0.0);
              auVar23._12_4_ = -(uint)((pAVar48->p).field_0.m128[2] != 0.0);
              uVar56 = movmskps(uVar56,auVar23);
              if ((((bVar11 & (byte)uVar56) != 0) || ((uVar56 & 2) != 0)) || ((uVar56 & 4) != 0))
              goto LAB_0015e402;
              bVar52 = ((byte)uVar56 & 8) >> 3;
              uVar56 = CONCAT31((int3)(uVar56 >> 8),bVar52);
              uVar55 = (ulong)uVar56;
              if ((bVar52 != 0) ||
                 ((bVar11 != false &&
                  ((fVar60 = (pAVar48->p).field_0.m128[3], fVar60 != 1.0 || (NAN(fVar60)))))))
              goto LAB_0015e402;
              local_1b8[8] = bVar12;
              pfVar1 = (float *)(lVar15 + -0x30 + lVar53);
              fVar76 = *pfVar1;
              local_1f8 = pfVar1[1];
              fVar79 = pfVar1[2];
              fVar60 = pfVar1[3];
              pfVar1 = (float *)(lVar15 + -0x20 + lVar53);
              fVar88 = *pfVar1;
              fVar74 = pfVar1[1];
              fVar96 = pfVar1[2];
              fVar98 = pfVar1[3];
              pfVar1 = (float *)(lVar15 + -0x10 + lVar53);
              fVar80 = *pfVar1;
              fVar82 = pfVar1[1];
              fVar84 = pfVar1[2];
              fVar75 = pfVar1[3];
              pfVar1 = (float *)(lVar15 + lVar53);
              fVar103 = *pfVar1;
              fVar83 = pfVar1[1];
              fVar67 = pfVar1[2];
              fVar86 = pfVar1[3];
            }
LAB_0015eede:
            auVar115._8_8_ = uVar55;
            auVar115._0_8_ = local_1b8._0_8_;
            pfVar1 = (float *)((long)&((Vector *)(local_1b8._0_8_ + -0x30))->field_0 + lVar53);
            *pfVar1 = fVar76;
            pfVar1[1] = local_1f8;
            pfVar1[2] = fVar79;
            pfVar1[3] = fVar60;
            pfVar1 = (float *)((long)&((Vector *)(local_1b8._0_8_ + -0x20))->field_0 + lVar53);
            *pfVar1 = fVar88;
            pfVar1[1] = fVar74;
            pfVar1[2] = fVar96;
            pfVar1[3] = fVar98;
            pfVar1 = (float *)((long)&((Vector *)(local_1b8._0_8_ + -0x10))->field_0 + lVar53);
            *pfVar1 = fVar80;
            pfVar1[1] = fVar82;
            pfVar1[2] = fVar84;
            pfVar1[3] = fVar75;
            pfVar1 = (float *)(local_1b8._0_8_ + lVar53);
            *pfVar1 = fVar103;
            pfVar1[1] = fVar83;
            pfVar1[2] = fVar67;
            pfVar1[3] = fVar86;
            uVar54 = uVar54 + 1;
            lVar53 = lVar53 + 0x40;
          } while (uVar54 < (ulong)plVar46[0xf]);
        }
      }
      else if (plVar46[0xf] == 1) {
        fVar60 = (spaces->time_range).lower;
        fVar79 = (spaces->time_range).upper;
        fVar88 = (float)plVar46[0xd];
        fVar103 = (float)((ulong)plVar46[0xd] >> 0x20);
        uVar56 = -(uint)(fVar60 < fVar88);
        uVar58 = -(uint)(fVar79 < fVar103);
        local_1d8._4_4_ = ~uVar58 & (uint)fVar103 | (uint)fVar79 & uVar58;
        local_1d8._0_4_ = ~uVar56 & (uint)fVar60 | (uint)fVar88 & uVar56;
        local_1c8._M_allocated_capacity = 0;
        local_1c8._8_8_ = 0;
        local_1b8._0_8_ = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
        local_130 = (vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
                     *)group;
        if (sVar14 != 0) {
          local_1b8._0_8_ = alignedMalloc(sVar14 << 6,0x10);
          uVar54 = extraout_RDX_03;
          local_1c8._8_8_ = sVar14;
        }
        pAVar48 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x1;
        if (spaces->quaternion == false) {
          pAVar48 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                    (ulong)*(uint *)(plVar46 + 0x12);
        }
        local_1b8._8_8_ = CONCAT71(SUB87(local_1b8._8_8_,1),(char)pAVar48);
        local_1c8._0_8_ = local_1c8._8_8_;
        if ((spaces->spaces).size_active != 0) {
          lVar53 = 0x30;
          uVar55 = 0;
          do {
            uVar42 = local_1b8._8_8_;
            uVar56 = (uint)uVar54;
            pAVar16 = (spaces->spaces).items;
            pfVar1 = (float *)plVar46[0x11];
            bVar11 = spaces->quaternion;
            bVar12 = *(byte *)(plVar46 + 0x12);
            local_1b8._8_8_ = local_1b8._8_8_ & 0xffffffffffffff00;
            uVar43 = local_1b8._8_8_;
            fVar60 = *(float *)((long)pAVar16 + lVar53 + -0x30);
            uVar9 = *(undefined8 *)((long)pAVar16 + lVar53 + -0x2c);
            fVar79 = (float)((ulong)uVar9 >> 0x20);
            local_1f8 = (float)uVar9;
            local_1b8._9_7_ = SUB87(uVar42,1);
            if ((((fVar60 != 1.0) || (NAN(fVar60))) || (local_1f8 != 0.0)) ||
               (((NAN(local_1f8) || (fVar79 != 0.0)) || (NAN(fVar79))))) {
LAB_0015f112:
              fVar88 = (float)*(undefined8 *)pfVar1;
              fVar103 = (float)((ulong)*(undefined8 *)pfVar1 >> 0x20);
              iVar57 = -(uint)(fVar88 != 1.0);
              iVar59 = -(uint)(fVar103 != 0.0);
              auVar64._4_4_ = iVar59;
              auVar64._0_4_ = iVar57;
              auVar64._8_4_ = iVar59;
              auVar64._12_4_ = iVar59;
              auVar63._8_8_ = auVar64._8_8_;
              auVar63._4_4_ = iVar57;
              auVar63._0_4_ = iVar57;
              uVar56 = movmskpd(uVar56,auVar63);
              uVar54 = (ulong)uVar56;
              fVar60 = pfVar1[2];
              if ((uVar56 & 1) == 0) {
                bVar52 = (byte)uVar56 >> 1;
                uVar56 = CONCAT31((int3)(uVar56 >> 8),bVar52);
                uVar54 = (ulong)uVar56;
                if (((bVar52 == 0) && (fVar60 == 0.0)) && (!NAN(fVar60))) {
                  auVar36._4_4_ = -(uint)(pfVar1[4] != 0.0);
                  auVar36._0_4_ = -(uint)(pfVar1[3] != 0.0);
                  auVar36._8_4_ = -(uint)(pfVar1[5] != 1.0);
                  auVar36._12_4_ = -(uint)(pfVar1[6] != 0.0);
                  uVar56 = movmskps(uVar56,auVar36);
                  uVar54 = (ulong)uVar56;
                  if ((((bVar12 & (byte)uVar56) == 0) && ((uVar56 & 2) == 0)) && ((uVar56 & 4) == 0)
                     ) {
                    bVar52 = ((byte)uVar56 & 8) >> 3;
                    uVar56 = CONCAT31((int3)(uVar56 >> 8),bVar52);
                    uVar54 = (ulong)uVar56;
                    if (bVar52 == 0) {
                      auVar37._4_4_ = -(uint)(pfVar1[8] != 0.0);
                      auVar37._0_4_ = -(uint)(pfVar1[7] != 0.0);
                      auVar37._8_4_ = -(uint)(pfVar1[9] != 0.0);
                      auVar37._12_4_ = -(uint)(pfVar1[10] != 1.0);
                      uVar56 = movmskps(uVar56,auVar37);
                      uVar54 = (ulong)uVar56;
                      if ((((bVar12 & (byte)uVar56) == 0) && ((uVar56 & 2) == 0)) &&
                         ((uVar56 & 4) == 0)) {
                        bVar52 = ((byte)uVar56 & 8) >> 3;
                        uVar56 = CONCAT31((int3)(uVar56 >> 8),bVar52);
                        uVar54 = (ulong)uVar56;
                        if (bVar52 == 0) {
                          auVar38._4_4_ = -(uint)(pfVar1[0xc] != 0.0);
                          auVar38._0_4_ = -(uint)(pfVar1[0xb] != 0.0);
                          auVar38._8_4_ = -(uint)(pfVar1[0xd] != 0.0);
                          auVar38._12_4_ = -(uint)(pfVar1[0xe] != 0.0);
                          uVar56 = movmskps(uVar56,auVar38);
                          uVar54 = (ulong)uVar56;
                          if ((((((bVar12 & (byte)uVar56) == 0) && ((uVar56 & 2) == 0)) &&
                               ((uVar56 & 4) == 0)) &&
                              (bVar52 = ((byte)uVar56 & 8) >> 3,
                              uVar54 = (ulong)CONCAT31((int3)(uVar56 >> 8),bVar52), bVar52 == 0)) &&
                             ((bVar12 == 0 || ((pfVar1[0xf] == 1.0 && (!NAN(pfVar1[0xf]))))))) {
                            local_1b8[8] = bVar11;
                            pfVar1 = (float *)((long)pAVar16 + lVar53 + -0x30);
                            fVar76 = *pfVar1;
                            local_1f8 = pfVar1[1];
                            fVar79 = pfVar1[2];
                            fVar60 = pfVar1[3];
                            pfVar1 = (float *)((long)pAVar16 + lVar53 + -0x20);
                            fVar88 = *pfVar1;
                            fVar74 = pfVar1[1];
                            fVar96 = pfVar1[2];
                            fVar98 = pfVar1[3];
                            pfVar1 = (float *)((long)pAVar16 + lVar53 + -0x10);
                            fVar80 = *pfVar1;
                            fVar82 = pfVar1[1];
                            fVar84 = pfVar1[2];
                            fVar75 = pfVar1[3];
                            pfVar1 = (float *)((long)&(pAVar16->l).vx.field_0 + lVar53);
                            fVar103 = *pfVar1;
                            fVar83 = pfVar1[1];
                            fVar67 = pfVar1[2];
                            fVar86 = pfVar1[3];
                            goto LAB_0015fc0e;
                          }
                        }
                      }
                    }
                  }
                }
              }
              local_1b8._8_8_ = uVar43;
              if ((bVar11 == false) && (bVar12 == 0)) {
                pfVar2 = (float *)((long)pAVar16 + lVar53 + -0x30);
                fVar113 = *pfVar2;
                fVar68 = pfVar2[1];
                fVar69 = pfVar2[2];
                fVar70 = pfVar2[3];
                pfVar2 = (float *)((long)pAVar16 + lVar53 + -0x20);
                fVar71 = *pfVar2;
                fVar72 = pfVar2[1];
                fVar73 = pfVar2[2];
                fVar77 = pfVar2[3];
                pfVar2 = (float *)((long)pAVar16 + lVar53 + -0x10);
                fVar78 = *pfVar2;
                fVar111 = pfVar2[1];
                fVar81 = pfVar2[2];
                fVar112 = pfVar2[3];
                fVar76 = fVar88 * fVar113 + fVar103 * fVar71 + fVar60 * fVar78;
                local_1f8 = fVar88 * fVar68 + fVar103 * fVar72 + fVar60 * fVar111;
                fVar79 = fVar88 * fVar69 + fVar103 * fVar73 + fVar60 * fVar81;
                fVar74 = pfVar1[4];
                fVar8 = pfVar1[5];
                fVar104 = pfVar1[6];
                fVar75 = pfVar1[8];
                fVar96 = fVar74 * fVar69 + fVar8 * fVar73 + fVar104 * fVar81;
                fVar98 = fVar74 * fVar70 + fVar8 * fVar77 + fVar104 * fVar112;
                fVar83 = pfVar1[9];
                fVar67 = pfVar1[10];
                fVar80 = fVar75 * fVar113 + fVar83 * fVar71 + fVar67 * fVar78;
                fVar82 = fVar75 * fVar68 + fVar83 * fVar72 + fVar67 * fVar111;
                fVar84 = fVar75 * fVar69 + fVar83 * fVar73 + fVar67 * fVar81;
                fVar86 = pfVar1[0xc];
                fVar105 = pfVar1[0xd];
                fVar110 = pfVar1[0xe];
                pfVar1 = (float *)((long)&(pAVar16->l).vx.field_0 + lVar53);
                fVar75 = fVar75 * fVar70 + fVar83 * fVar77 + fVar67 * fVar112;
                fVar60 = fVar88 * fVar70 + fVar103 * fVar77 + fVar60 * fVar112;
                fVar103 = fVar86 * fVar113 + fVar105 * fVar71 + fVar110 * fVar78 + *pfVar1;
                fVar83 = fVar86 * fVar68 + fVar105 * fVar72 + fVar110 * fVar111 + pfVar1[1];
                fVar67 = fVar86 * fVar69 + fVar105 * fVar73 + fVar110 * fVar81 + pfVar1[2];
                fVar86 = fVar86 * fVar70 + fVar105 * fVar77 + fVar110 * fVar112 + pfVar1[3];
                fVar88 = fVar74 * fVar113 + fVar8 * fVar71 + fVar104 * fVar78;
                fVar74 = fVar74 * fVar68 + fVar8 * fVar72 + fVar104 * fVar111;
              }
              else if ((bVar11 == false) || (bVar12 == 0)) {
                if ((bVar11 == false) || (bVar12 != 0)) {
                  if ((local_1f8 != 0.0) ||
                     ((((NAN(local_1f8) || (fVar79 != 0.0)) || (NAN(fVar79))) ||
                      (uVar9 = *(undefined8 *)((long)pAVar16 + lVar53 + -0x10),
                      auVar28._4_4_ = -(uint)(*(float *)((long)pAVar16 + lVar53 + -0x20) != 0.0),
                      auVar28._0_4_ = -(uint)(*(float *)((long)pAVar16 + lVar53 + -0x18) != 0.0),
                      auVar28._8_4_ = -(uint)((float)uVar9 != 0.0),
                      auVar28._12_4_ = -(uint)((float)((ulong)uVar9 >> 0x20) != 0.0),
                      uVar45 = movmskps((int)CONCAT71((int7)((ulong)pAVar48 >> 8),bVar12),auVar28),
                      (char)uVar45 != '\0')))) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,
                               "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                               ,0x83);
                    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
                    std::ostream::put(' ');
                    std::ostream::flush();
                    uVar54 = extraout_RDX_06;
                  }
                  fVar60 = pfVar1[3];
                  fVar88 = pfVar1[4];
                  fVar98 = pfVar1[7];
                  fVar80 = pfVar1[8];
                  fVar82 = pfVar1[9];
                  fVar75 = pfVar1[0xb];
                  fVar103 = pfVar1[0xc];
                  fVar83 = pfVar1[0xd];
                  fVar67 = pfVar1[0xe];
                  fVar86 = pfVar1[0xf];
                  uVar9 = *(undefined8 *)((long)&(pAVar16->l).vx.field_0 + lVar53);
                  fVar76 = *(float *)((long)pAVar16 + lVar53 + -0x30) * *pfVar1;
                  local_1f8 = pfVar1[1] + (float)uVar9;
                  fVar79 = pfVar1[2] + (float)((ulong)uVar9 >> 0x20);
                  fVar96 = pfVar1[6] + *(float *)((long)&(pAVar16->l).vx.field_0 + lVar53 + 8);
                  fVar74 = pfVar1[5] * *(float *)((long)pAVar16 + lVar53 + -0x1c);
                  fVar84 = pfVar1[10] * *(float *)((long)pAVar16 + lVar53 + -8);
                  local_1b8[8] = 1;
                }
                else {
                  local_d8 = ZEXT416(*(uint *)((long)&(pAVar16->l).vx.field_0 + lVar53 + 0xc));
                  local_b8 = ZEXT416(*(uint *)((long)pAVar16 + lVar53 + -0x24));
                  local_e8 = ZEXT416(*(uint *)((long)pAVar16 + lVar53 + -4));
                  pfVar2 = (float *)((long)pAVar16 + lVar53 + -0x20);
                  local_f8 = *pfVar2;
                  fStack_f4 = pfVar2[1];
                  fStack_ec = pfVar2[3];
                  pfVar2 = (float *)((long)pAVar16 + lVar53 + -0x10);
                  local_108 = *pfVar2;
                  fStack_104 = pfVar2[1];
                  fStack_100 = pfVar2[2];
                  fStack_fc = pfVar2[3];
                  local_c8 = *(undefined8 *)((long)pAVar16 + lVar53 + -0x18);
                  uStack_c0 = 0;
                  pfVar2 = (float *)((long)pAVar16 + lVar53 + -0x30);
                  local_148.lower = *pfVar2;
                  fVar60 = pfVar2[1];
                  fVar88 = *pfVar1;
                  fVar103 = pfVar1[1];
                  fVar98 = pfVar1[2];
                  fVar80 = pfVar1[4];
                  fVar82 = pfVar1[5];
                  fVar75 = pfVar1[6];
                  local_118 = *(undefined8 *)(pfVar1 + 8);
                  uStack_110 = *(undefined8 *)(pfVar1 + 10);
                  fVar83 = pfVar1[0xc];
                  fVar67 = pfVar1[0xd];
                  fVar86 = pfVar1[0xe];
                  fVar76 = fVar88 * local_148.lower + fVar103 * local_f8 + fVar98 * local_108;
                  fVar74 = fVar88 * 0.0 + fVar103 * fStack_f4 + fVar98 * fStack_104;
                  fVar88 = fVar88 * 0.0 + fVar103 * 0.0 + fVar98 * fStack_100;
                  fStack_190 = fVar80 * 0.0 + fVar82 * 0.0 + fVar75 * fStack_100;
                  fStack_18c = fVar80 * fVar60 + fVar82 * fStack_ec + fVar75 * fStack_fc;
                  local_198 = (long *)CONCAT44(fVar80 * 0.0 +
                                               fVar82 * fStack_f4 + fVar75 * fStack_104,
                                               fVar80 * local_148.lower +
                                               fVar82 * local_f8 + fVar75 * local_108);
                  fStack_f0 = 0.0;
                  local_148.upper = 0.0;
                  lStack_140 = (ulong)(uint)fVar60 << 0x20;
                  pfVar1 = (float *)((long)&(pAVar16->l).vx.field_0 + lVar53);
                  local_a8 = fVar83 * local_148.lower + fVar67 * local_f8 + fVar86 * local_108 +
                             *pfVar1;
                  fStack_a4 = fVar83 * 0.0 + fVar67 * fStack_f4 + fVar86 * fStack_104 + pfVar1[1];
                  fStack_a0 = fVar83 * 0.0 + fVar67 * 0.0 + fVar86 * fStack_100 + pfVar1[2];
                  fStack_9c = fVar83 * fVar60 + fVar67 * fStack_ec + fVar86 * fStack_fc + pfVar1[3];
                  if ((((fVar74 != 0.0) || (NAN(fVar74))) ||
                      ((fVar88 != 0.0 || ((NAN(fVar88) || (fStack_190 != 0.0)))))) ||
                     (NAN(fStack_190))) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,
                               "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                               ,0x61);
                    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
                    std::ostream::put(' ');
                    std::ostream::flush();
                    uVar54 = extraout_RDX_05;
                  }
                  fVar80 = local_148.lower * (float)local_118 +
                           local_f8 * local_118._4_4_ + local_108 * (float)uStack_110;
                  fVar82 = local_148.upper * (float)local_118 +
                           fStack_f4 * local_118._4_4_ + fStack_104 * (float)uStack_110;
                  fVar84 = (float)lStack_140 * (float)local_118 +
                           fStack_f0 * local_118._4_4_ + fStack_100 * (float)uStack_110;
                  local_1b8[8] = 1;
                  fVar96 = (float)local_c8;
                  fVar98 = (float)((ulong)local_c8 >> 0x20);
                  fVar75 = (float)local_e8._0_4_;
                  fVar60 = (float)local_b8._0_4_;
                  fVar103 = local_a8;
                  fVar83 = fStack_a4;
                  fVar67 = fStack_a0;
                  fVar86 = (float)local_d8._0_4_;
                  fVar88 = (float)local_198;
                  fVar74 = local_198._4_4_;
                }
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                           ,0x67);
                std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
                std::ostream::put(' ');
                std::ostream::flush();
                fVar60 = *(float *)((long)&(pAVar16->l).vx.field_0 + lVar53 + 0xc);
                fVar79 = *(float *)((long)pAVar16 + lVar53 + -0x24);
                fVar88 = *(float *)((long)pAVar16 + lVar53 + -0x14);
                fVar103 = *(float *)((long)pAVar16 + lVar53 + -4);
                auVar115 = *(undefined1 (*) [16])((long)pAVar16 + lVar53 + -0x30);
                pfVar2 = (float *)((long)pAVar16 + lVar53 + -0x20);
                fVar98 = *pfVar2;
                fVar80 = pfVar2[1];
                pfVar3 = (float *)((long)pAVar16 + lVar53 + -0x10);
                fVar82 = *pfVar3;
                fVar75 = pfVar3[1];
                fVar83 = pfVar3[2];
                fVar105 = fVar79 * fVar88 + fVar60 * fVar103;
                fVar76 = fVar79 * fVar88 - fVar60 * fVar103;
                fVar96 = fVar60 * fVar60 + fVar79 * fVar79 + -fVar88 * fVar88 + -fVar103 * fVar103;
                fVar84 = fVar60 * fVar60 - fVar79 * fVar79;
                fVar104 = fVar88 * fVar88 + fVar84 + -fVar103 * fVar103;
                fVar113 = fVar79 * fVar103 - fVar60 * fVar88;
                fVar67 = fVar60 * fVar88 + fVar79 * fVar103;
                fVar110 = fVar88 * fVar103 + fVar60 * fVar79;
                fVar60 = fVar88 * fVar103 - fVar60 * fVar79;
                pfVar3 = (float *)((long)&(pAVar16->l).vx.field_0 + lVar53);
                fVar86 = *pfVar3;
                fVar74 = pfVar3[1];
                fVar8 = pfVar3[2];
                fVar105 = fVar105 + fVar105;
                fVar113 = fVar113 + fVar113;
                fVar76 = fVar76 + fVar76;
                fVar110 = fVar110 + fVar110;
                fVar67 = fVar67 + fVar67;
                fVar60 = fVar60 + fVar60;
                fVar79 = fVar103 * fVar103 + fVar84 + -fVar88 * fVar88;
                fVar92 = fVar96 * 1.0 + fVar105 * 0.0 + fVar113 * 0.0;
                fVar94 = fVar96 * 0.0 + fVar105 * 1.0 + fVar113 * 0.0;
                fVar97 = fVar96 * 0.0 + fVar105 * 0.0 + fVar113 * 1.0;
                fVar99 = fVar96 * 0.0 + fVar105 * 0.0 + fVar113 * 0.0;
                fVar87 = fVar76 * 1.0 + fVar104 * 0.0 + fVar110 * 0.0;
                fVar89 = fVar76 * 0.0 + fVar104 * 1.0 + fVar110 * 0.0;
                fVar90 = fVar76 * 0.0 + fVar104 * 0.0 + fVar110 * 1.0;
                fVar91 = fVar76 * 0.0 + fVar104 * 0.0 + fVar110 * 0.0;
                fVar110 = fVar67 * 1.0 + fVar60 * 0.0 + fVar79 * 0.0;
                fVar68 = fVar67 * 0.0 + fVar60 * 1.0 + fVar79 * 0.0;
                fVar70 = fVar67 * 0.0 + fVar60 * 0.0 + fVar79 * 1.0;
                fVar72 = fVar67 * 0.0 + fVar60 * 0.0 + fVar79 * 0.0;
                local_1e8 = auVar115._4_4_;
                fStack_1e4 = auVar115._8_4_;
                local_1f8 = auVar115._0_4_;
                fVar106 = local_1f8 * fVar92 + fVar87 * 0.0 + fVar110 * 0.0;
                fVar107 = local_1f8 * fVar94 + fVar89 * 0.0 + fVar68 * 0.0;
                fVar108 = local_1f8 * fVar97 + fVar90 * 0.0 + fVar70 * 0.0;
                fVar109 = local_1f8 * fVar99 + fVar91 * 0.0 + fVar72 * 0.0;
                fVar113 = fVar98 * fVar92 + fVar80 * fVar87 + fVar110 * 0.0;
                fVar69 = fVar98 * fVar94 + fVar80 * fVar89 + fVar68 * 0.0;
                fVar71 = fVar98 * fVar97 + fVar80 * fVar90 + fVar70 * 0.0;
                fVar73 = fVar98 * fVar99 + fVar80 * fVar91 + fVar72 * 0.0;
                fVar104 = fVar82 * fVar92 + fVar75 * fVar87 + fVar83 * fVar110;
                fVar105 = fVar82 * fVar94 + fVar75 * fVar89 + fVar83 * fVar68;
                fStack_190 = fVar82 * fVar97 + fVar75 * fVar90 + fVar83 * fVar70;
                fStack_18c = fVar82 * fVar99 + fVar75 * fVar91 + fVar83 * fVar72;
                local_198 = (long *)CONCAT44(fVar105,fVar104);
                fVar60 = pfVar1[0xf];
                fVar79 = pfVar1[3];
                fVar88 = pfVar1[7];
                fVar103 = pfVar1[0xb];
                fVar84 = fVar79 * fVar88 + fVar60 * fVar103;
                fVar76 = fVar79 * fVar88 - fVar60 * fVar103;
                fVar96 = fVar60 * fVar60 + fVar79 * fVar79 + -fVar88 * fVar88 + -fVar103 * fVar103;
                fVar80 = fVar60 * fVar60 - fVar79 * fVar79;
                fVar112 = fVar88 * fVar88 + fVar80 + -fVar103 * fVar103;
                fVar111 = fVar79 * fVar103 - fVar60 * fVar88;
                fVar81 = fVar60 * fVar88 + fVar79 * fVar103;
                fVar114 = fVar88 * fVar103 + fVar60 * fVar79;
                fVar67 = fVar88 * fVar103 - fVar60 * fVar79;
                fVar60 = *pfVar1;
                fVar79 = pfVar1[4];
                fVar98 = pfVar1[5];
                fVar100 = fVar103 * fVar103 + fVar80 + -fVar88 * fVar88;
                fVar88 = pfVar1[8];
                fVar103 = pfVar1[9];
                fVar80 = pfVar1[10];
                fVar84 = fVar84 + fVar84;
                fVar111 = fVar111 + fVar111;
                fVar82 = pfVar1[0xc];
                fVar75 = pfVar1[0xd];
                fVar83 = pfVar1[0xe];
                fVar77 = fVar96 * 1.0 + fVar84 * 0.0 + fVar111 * 0.0;
                fVar78 = fVar96 * 0.0 + fVar84 * 1.0 + fVar111 * 0.0;
                fVar111 = fVar96 * 0.0 + fVar84 * 0.0 + fVar111 * 1.0;
                fVar76 = fVar76 + fVar76;
                fVar114 = fVar114 + fVar114;
                fVar81 = fVar81 + fVar81;
                fVar67 = fVar67 + fVar67;
                fVar96 = fVar76 * 1.0 + fVar112 * 0.0 + fVar114 * 0.0;
                fVar84 = fVar76 * 0.0 + fVar112 * 1.0 + fVar114 * 0.0;
                fVar76 = fVar76 * 0.0 + fVar112 * 0.0 + fVar114 * 1.0;
                fVar112 = fVar81 * 1.0 + fVar67 * 0.0 + fVar100 * 0.0;
                fVar114 = fVar81 * 0.0 + fVar67 * 1.0 + fVar100 * 0.0;
                fVar67 = fVar81 * 0.0 + fVar67 * 0.0 + fVar100 * 1.0;
                fVar93 = fVar60 * fVar77 + fVar96 * 0.0 + fVar112 * 0.0;
                fVar95 = fVar60 * fVar78 + fVar84 * 0.0 + fVar114 * 0.0;
                fVar60 = fVar60 * fVar111 + fVar76 * 0.0 + fVar67 * 0.0;
                fVar81 = fVar79 * fVar77 + fVar98 * fVar96 + fVar112 * 0.0;
                fVar100 = fVar79 * fVar78 + fVar98 * fVar84 + fVar114 * 0.0;
                fVar85 = fVar79 * fVar111 + fVar98 * fVar76 + fVar67 * 0.0;
                fVar101 = fVar88 * fVar77 + fVar103 * fVar96 + fVar80 * fVar112;
                fVar102 = fVar88 * fVar78 + fVar103 * fVar84 + fVar80 * fVar114;
                fVar103 = fVar88 * fVar111 + fVar103 * fVar76 + fVar80 * fVar67;
                fVar88 = fVar82 * fVar77 + fVar75 * fVar96 + fVar83 * fVar112 + pfVar1[1] + 0.0;
                fVar77 = fVar82 * fVar78 + fVar75 * fVar84 + fVar83 * fVar114 + pfVar1[2] + 0.0;
                fVar78 = fVar82 * fVar111 + fVar75 * fVar76 + fVar83 * fVar67 + pfVar1[6] + 0.0;
                fVar76 = fVar93 * fVar106 + fVar95 * fVar113 + fVar60 * fVar104;
                local_1f8 = fVar93 * fVar107 + fVar95 * fVar69 + fVar60 * fVar105;
                fVar79 = fVar93 * fVar108 + fVar95 * fVar71 + fVar60 * fStack_190;
                fVar96 = fVar81 * fVar108 + fVar100 * fVar71 + fVar85 * fStack_190;
                fVar98 = fVar81 * fVar109 + fVar100 * fVar73 + fVar85 * fStack_18c;
                fVar80 = fVar101 * fVar106 + fVar102 * fVar113 + fVar103 * fVar104;
                fVar82 = fVar101 * fVar107 + fVar102 * fVar69 + fVar103 * fVar105;
                fVar84 = fVar101 * fVar108 + fVar102 * fVar71 + fVar103 * fStack_190;
                uVar54 = extraout_RDX_04;
                fVar75 = fVar101 * fVar109 + fVar102 * fVar73 + fVar103 * fStack_18c;
                fVar60 = fVar93 * fVar109 + fVar95 * fVar73 + fVar60 * fStack_18c;
                fVar103 = fVar88 * fVar106 + fVar77 * fVar113 + fVar78 * fVar104 +
                          fVar86 * fVar92 + fVar74 * fVar87 + fVar8 * fVar110 + local_1e8 + 0.0;
                fVar83 = fVar88 * fVar107 + fVar77 * fVar69 + fVar78 * fVar105 +
                         fVar86 * fVar94 + fVar74 * fVar89 + fVar8 * fVar68 + fStack_1e4 + 0.0;
                fVar67 = fVar88 * fVar108 + fVar77 * fVar71 + fVar78 * fStack_190 +
                         fVar86 * fVar97 + fVar74 * fVar90 + fVar8 * fVar70 + pfVar2[2] + 0.0;
                fVar86 = fVar88 * fVar109 + fVar77 * fVar73 + fVar78 * fStack_18c +
                         fVar86 * fVar99 + fVar74 * fVar91 + fVar8 * fVar72 + 0.0;
                fVar88 = fVar81 * fVar106 + fVar100 * fVar113 + fVar85 * fVar104;
                fVar74 = fVar81 * fVar107 + fVar100 * fVar69 + fVar85 * fVar105;
              }
            }
            else {
              pfVar2 = (float *)((long)pAVar16 + lVar53 + -0x24);
              auVar25._4_4_ = -(uint)(pfVar2[1] != 0.0);
              auVar25._0_4_ = -(uint)(*pfVar2 != 0.0);
              auVar25._8_4_ = -(uint)(pfVar2[2] != 1.0);
              auVar25._12_4_ = -(uint)(pfVar2[3] != 0.0);
              uVar56 = movmskps(uVar56,auVar25);
              if ((((bVar11 & (byte)uVar56) != 0) || ((uVar56 & 2) != 0)) ||
                 (((uVar56 & 4) != 0 ||
                  (bVar52 = ((byte)uVar56 & 8) >> 3, uVar56 = CONCAT31((int3)(uVar56 >> 8),bVar52),
                  bVar52 != 0)))) goto LAB_0015f112;
              pfVar2 = (float *)((long)pAVar16 + lVar53 + -0x14);
              auVar26._4_4_ = -(uint)(pfVar2[1] != 0.0);
              auVar26._0_4_ = -(uint)(*pfVar2 != 0.0);
              auVar26._8_4_ = -(uint)(pfVar2[2] != 0.0);
              auVar26._12_4_ = -(uint)(pfVar2[3] != 1.0);
              uVar56 = movmskps(uVar56,auVar26);
              if (((((bVar11 & (byte)uVar56) != 0) || ((uVar56 & 2) != 0)) || ((uVar56 & 4) != 0))
                 || (bVar52 = ((byte)uVar56 & 8) >> 3, uVar56 = CONCAT31((int3)(uVar56 >> 8),bVar52)
                    , bVar52 != 0)) goto LAB_0015f112;
              pfVar2 = (float *)((long)pAVar16 + lVar53 + -4);
              auVar27._4_4_ = -(uint)(pfVar2[1] != 0.0);
              auVar27._0_4_ = -(uint)(*pfVar2 != 0.0);
              auVar27._8_4_ = -(uint)(pfVar2[2] != 0.0);
              auVar27._12_4_ = -(uint)(pfVar2[3] != 0.0);
              uVar56 = movmskps(uVar56,auVar27);
              if ((((bVar11 & (byte)uVar56) != 0) || ((uVar56 & 2) != 0)) || ((uVar56 & 4) != 0))
              goto LAB_0015f112;
              bVar52 = ((byte)uVar56 & 8) >> 3;
              uVar56 = CONCAT31((int3)(uVar56 >> 8),bVar52);
              uVar54 = (ulong)uVar56;
              if ((bVar52 != 0) ||
                 ((bVar11 != false &&
                  ((fVar60 = *(float *)((long)&(pAVar16->l).vx.field_0 + lVar53 + 0xc),
                   fVar60 != 1.0 || (NAN(fVar60))))))) goto LAB_0015f112;
              local_1b8[8] = bVar12;
              fVar76 = *pfVar1;
              local_1f8 = pfVar1[1];
              fVar79 = pfVar1[2];
              fVar60 = pfVar1[3];
              fVar88 = pfVar1[4];
              fVar74 = pfVar1[5];
              fVar96 = pfVar1[6];
              fVar98 = pfVar1[7];
              fVar80 = pfVar1[8];
              fVar82 = pfVar1[9];
              fVar84 = pfVar1[10];
              fVar75 = pfVar1[0xb];
              fVar103 = pfVar1[0xc];
              fVar83 = pfVar1[0xd];
              fVar67 = pfVar1[0xe];
              fVar86 = pfVar1[0xf];
            }
LAB_0015fc0e:
            pfVar1 = (float *)((long)&((Vector *)(local_1b8._0_8_ + -0x30))->field_0 + lVar53);
            *pfVar1 = fVar76;
            pfVar1[1] = local_1f8;
            pfVar1[2] = fVar79;
            pfVar1[3] = fVar60;
            pfVar1 = (float *)((long)&((Vector *)(local_1b8._0_8_ + -0x20))->field_0 + lVar53);
            *pfVar1 = fVar88;
            pfVar1[1] = fVar74;
            pfVar1[2] = fVar96;
            pfVar1[3] = fVar98;
            pfVar1 = (float *)((long)&((Vector *)(local_1b8._0_8_ + -0x10))->field_0 + lVar53);
            *pfVar1 = fVar80;
            pfVar1[1] = fVar82;
            pfVar1[2] = fVar84;
            pfVar1[3] = fVar75;
            pfVar1 = (float *)(local_1b8._0_8_ + lVar53);
            *pfVar1 = fVar103;
            pfVar1[1] = fVar83;
            pfVar1[2] = fVar67;
            pfVar1[3] = fVar86;
            uVar55 = uVar55 + 1;
            lVar53 = lVar53 + 0x40;
            pAVar48 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)local_1b8._0_8_;
          } while (uVar55 < (spaces->spaces).size_active);
        }
      }
      else {
        if (sVar14 != plVar46[0xf]) {
          local_130 = (vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
                       *)group;
          prVar51 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar51,"number of transformations does not match");
          __cxa_throw(prVar51,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        fVar60 = (spaces->time_range).lower;
        fVar79 = (spaces->time_range).upper;
        fVar88 = (float)plVar46[0xd];
        fVar103 = (float)((ulong)plVar46[0xd] >> 0x20);
        uVar56 = -(uint)(fVar60 < fVar88);
        uVar58 = -(uint)(fVar79 < fVar103);
        local_1d8._4_4_ = ~uVar58 & (uint)fVar103 | (uint)fVar79 & uVar58;
        local_1d8._0_4_ = ~uVar56 & (uint)fVar60 | (uint)fVar88 & uVar56;
        local_1c8._M_allocated_capacity = 0;
        local_1c8._8_8_ = 0;
        local_1b8._0_8_ = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
        local_130 = (vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
                     *)group;
        if (sVar14 != 0) {
          local_1b8._0_8_ = alignedMalloc(sVar14 << 6,0x10);
          uVar54 = extraout_RDX_07;
          local_1c8._8_8_ = sVar14;
        }
        pAVar48 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x1;
        if (spaces->quaternion == false) {
          pAVar48 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                    (ulong)*(uint *)(plVar46 + 0x12);
        }
        local_1b8._8_8_ = CONCAT71(SUB87(local_1b8._8_8_,1),(char)pAVar48);
        local_1c8._0_8_ = local_1c8._8_8_;
        if ((spaces->spaces).size_active != 0) {
          lVar53 = 0x30;
          uVar55 = 0;
          do {
            uVar42 = local_1b8._8_8_;
            uVar56 = (uint)uVar54;
            pAVar16 = (spaces->spaces).items;
            lVar15 = plVar46[0x11];
            bVar11 = spaces->quaternion;
            bVar12 = *(byte *)(plVar46 + 0x12);
            local_1b8._8_8_ = local_1b8._8_8_ & 0xffffffffffffff00;
            uVar43 = local_1b8._8_8_;
            fVar60 = *(float *)((long)pAVar16 + lVar53 + -0x30);
            uVar9 = *(undefined8 *)((long)pAVar16 + lVar53 + -0x2c);
            fVar79 = (float)((ulong)uVar9 >> 0x20);
            local_1f8 = (float)uVar9;
            local_1b8._9_7_ = SUB87(uVar42,1);
            if (((((fVar60 != 1.0) || (NAN(fVar60))) || (local_1f8 != 0.0)) ||
                ((NAN(local_1f8) || (fVar79 != 0.0)))) || (NAN(fVar79))) {
LAB_0015fe13:
              uVar9 = *(undefined8 *)(lVar15 + -0x30 + lVar53);
              fVar88 = (float)uVar9;
              fVar103 = (float)((ulong)uVar9 >> 0x20);
              iVar57 = -(uint)(fVar88 != 1.0);
              iVar59 = -(uint)(fVar103 != 0.0);
              auVar66._4_4_ = iVar59;
              auVar66._0_4_ = iVar57;
              auVar66._8_4_ = iVar59;
              auVar66._12_4_ = iVar59;
              auVar65._8_8_ = auVar66._8_8_;
              auVar65._4_4_ = iVar57;
              auVar65._0_4_ = iVar57;
              uVar56 = movmskpd(uVar56,auVar65);
              uVar54 = (ulong)uVar56;
              fVar60 = *(float *)(lVar15 + -0x28 + lVar53);
              if ((uVar56 & 1) == 0) {
                bVar52 = (byte)uVar56 >> 1;
                uVar56 = CONCAT31((int3)(uVar56 >> 8),bVar52);
                uVar54 = (ulong)uVar56;
                if (((bVar52 == 0) && (fVar60 == 0.0)) && (!NAN(fVar60))) {
                  pfVar1 = (float *)(lVar15 + -0x24 + lVar53);
                  auVar39._4_4_ = -(uint)(pfVar1[1] != 0.0);
                  auVar39._0_4_ = -(uint)(*pfVar1 != 0.0);
                  auVar39._8_4_ = -(uint)(pfVar1[2] != 1.0);
                  auVar39._12_4_ = -(uint)(pfVar1[3] != 0.0);
                  uVar56 = movmskps(uVar56,auVar39);
                  uVar54 = (ulong)uVar56;
                  if ((((bVar12 & (byte)uVar56) == 0) && ((uVar56 & 2) == 0)) && ((uVar56 & 4) == 0)
                     ) {
                    bVar52 = ((byte)uVar56 & 8) >> 3;
                    uVar56 = CONCAT31((int3)(uVar56 >> 8),bVar52);
                    uVar54 = (ulong)uVar56;
                    if (bVar52 == 0) {
                      pfVar1 = (float *)(lVar15 + -0x14 + lVar53);
                      auVar40._4_4_ = -(uint)(pfVar1[1] != 0.0);
                      auVar40._0_4_ = -(uint)(*pfVar1 != 0.0);
                      auVar40._8_4_ = -(uint)(pfVar1[2] != 0.0);
                      auVar40._12_4_ = -(uint)(pfVar1[3] != 1.0);
                      uVar56 = movmskps(uVar56,auVar40);
                      uVar54 = (ulong)uVar56;
                      if ((((bVar12 & (byte)uVar56) == 0) && ((uVar56 & 2) == 0)) &&
                         ((uVar56 & 4) == 0)) {
                        bVar52 = ((byte)uVar56 & 8) >> 3;
                        uVar56 = CONCAT31((int3)(uVar56 >> 8),bVar52);
                        uVar54 = (ulong)uVar56;
                        if (bVar52 == 0) {
                          pfVar1 = (float *)(lVar15 + -4 + lVar53);
                          auVar41._4_4_ = -(uint)(pfVar1[1] != 0.0);
                          auVar41._0_4_ = -(uint)(*pfVar1 != 0.0);
                          auVar41._8_4_ = -(uint)(pfVar1[2] != 0.0);
                          auVar41._12_4_ = -(uint)(pfVar1[3] != 0.0);
                          uVar56 = movmskps(uVar56,auVar41);
                          uVar54 = (ulong)uVar56;
                          if ((((((bVar12 & (byte)uVar56) == 0) && ((uVar56 & 2) == 0)) &&
                               ((uVar56 & 4) == 0)) &&
                              (bVar52 = ((byte)uVar56 & 8) >> 3,
                              uVar54 = (ulong)CONCAT31((int3)(uVar56 >> 8),bVar52), bVar52 == 0)) &&
                             ((bVar12 == 0 ||
                              ((fVar98 = *(float *)(lVar15 + 0xc + lVar53), fVar98 == 1.0 &&
                               (!NAN(fVar98))))))) {
                            local_1b8[8] = bVar11;
                            pfVar1 = (float *)((long)pAVar16 + lVar53 + -0x30);
                            fVar76 = *pfVar1;
                            local_1f8 = pfVar1[1];
                            fVar79 = pfVar1[2];
                            fVar60 = pfVar1[3];
                            pfVar1 = (float *)((long)pAVar16 + lVar53 + -0x20);
                            fVar88 = *pfVar1;
                            fVar74 = pfVar1[1];
                            fVar96 = pfVar1[2];
                            fVar98 = pfVar1[3];
                            pfVar1 = (float *)((long)pAVar16 + lVar53 + -0x10);
                            fVar80 = *pfVar1;
                            fVar82 = pfVar1[1];
                            fVar84 = pfVar1[2];
                            fVar75 = pfVar1[3];
                            pfVar1 = (float *)((long)&(pAVar16->l).vx.field_0 + lVar53);
                            fVar103 = *pfVar1;
                            fVar83 = pfVar1[1];
                            fVar67 = pfVar1[2];
                            fVar86 = pfVar1[3];
                            goto LAB_0016090f;
                          }
                        }
                      }
                    }
                  }
                }
              }
              local_1b8._8_8_ = uVar43;
              if ((bVar11 == false) && (bVar12 == 0)) {
                pfVar1 = (float *)((long)pAVar16 + lVar53 + -0x30);
                fVar113 = *pfVar1;
                fVar68 = pfVar1[1];
                fVar69 = pfVar1[2];
                fVar70 = pfVar1[3];
                pfVar1 = (float *)((long)pAVar16 + lVar53 + -0x20);
                fVar71 = *pfVar1;
                fVar72 = pfVar1[1];
                fVar73 = pfVar1[2];
                fVar77 = pfVar1[3];
                pfVar1 = (float *)((long)pAVar16 + lVar53 + -0x10);
                fVar78 = *pfVar1;
                fVar111 = pfVar1[1];
                fVar81 = pfVar1[2];
                fVar112 = pfVar1[3];
                fVar76 = fVar88 * fVar113 + fVar103 * fVar71 + fVar60 * fVar78;
                local_1f8 = fVar88 * fVar68 + fVar103 * fVar72 + fVar60 * fVar111;
                fVar79 = fVar88 * fVar69 + fVar103 * fVar73 + fVar60 * fVar81;
                fVar74 = *(float *)(lVar15 + -0x20 + lVar53);
                fVar8 = *(float *)(lVar15 + -0x1c + lVar53);
                fVar104 = *(float *)(lVar15 + -0x18 + lVar53);
                fVar75 = *(float *)(lVar15 + -0x10 + lVar53);
                fVar96 = fVar74 * fVar69 + fVar8 * fVar73 + fVar104 * fVar81;
                fVar98 = fVar74 * fVar70 + fVar8 * fVar77 + fVar104 * fVar112;
                fVar83 = *(float *)(lVar15 + -0xc + lVar53);
                fVar67 = *(float *)(lVar15 + -8 + lVar53);
                fVar80 = fVar75 * fVar113 + fVar83 * fVar71 + fVar67 * fVar78;
                fVar82 = fVar75 * fVar68 + fVar83 * fVar72 + fVar67 * fVar111;
                fVar84 = fVar75 * fVar69 + fVar83 * fVar73 + fVar67 * fVar81;
                fVar86 = *(float *)(lVar15 + lVar53);
                fVar105 = *(float *)(lVar15 + 4 + lVar53);
                fVar110 = *(float *)(lVar15 + 8 + lVar53);
                pfVar1 = (float *)((long)&(pAVar16->l).vx.field_0 + lVar53);
                fVar75 = fVar75 * fVar70 + fVar83 * fVar77 + fVar67 * fVar112;
                fVar60 = fVar88 * fVar70 + fVar103 * fVar77 + fVar60 * fVar112;
                fVar103 = fVar86 * fVar113 + fVar105 * fVar71 + fVar110 * fVar78 + *pfVar1;
                fVar83 = fVar86 * fVar68 + fVar105 * fVar72 + fVar110 * fVar111 + pfVar1[1];
                fVar67 = fVar86 * fVar69 + fVar105 * fVar73 + fVar110 * fVar81 + pfVar1[2];
                fVar86 = fVar86 * fVar70 + fVar105 * fVar77 + fVar110 * fVar112 + pfVar1[3];
                fVar88 = fVar74 * fVar113 + fVar8 * fVar71 + fVar104 * fVar78;
                fVar74 = fVar74 * fVar68 + fVar8 * fVar72 + fVar104 * fVar111;
              }
              else if ((bVar11 == false) || (bVar12 == 0)) {
                if ((bVar11 == false) || (bVar12 != 0)) {
                  if ((local_1f8 != 0.0) ||
                     ((((NAN(local_1f8) || (fVar79 != 0.0)) || (NAN(fVar79))) ||
                      (uVar9 = *(undefined8 *)((long)pAVar16 + lVar53 + -0x10),
                      auVar32._4_4_ = -(uint)(*(float *)((long)pAVar16 + lVar53 + -0x20) != 0.0),
                      auVar32._0_4_ = -(uint)(*(float *)((long)pAVar16 + lVar53 + -0x18) != 0.0),
                      auVar32._8_4_ = -(uint)((float)uVar9 != 0.0),
                      auVar32._12_4_ = -(uint)((float)((ulong)uVar9 >> 0x20) != 0.0),
                      uVar45 = movmskps((int)CONCAT71((int7)((ulong)pAVar48 >> 8),bVar12),auVar32),
                      (char)uVar45 != '\0')))) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,
                               "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                               ,0x83);
                    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
                    std::ostream::put(' ');
                    std::ostream::flush();
                    uVar54 = extraout_RDX_10;
                  }
                  pfVar2 = (float *)(lVar15 + -0x30 + lVar53);
                  fVar60 = pfVar2[3];
                  pfVar3 = (float *)(lVar15 + -0x20 + lVar53);
                  fVar88 = *pfVar3;
                  fVar98 = pfVar3[3];
                  pfVar5 = (float *)(lVar15 + -0x10 + lVar53);
                  fVar80 = *pfVar5;
                  fVar82 = pfVar5[1];
                  fVar75 = pfVar5[3];
                  pfVar1 = (float *)(lVar15 + lVar53);
                  fVar103 = *pfVar1;
                  fVar83 = pfVar1[1];
                  fVar67 = pfVar1[2];
                  fVar86 = pfVar1[3];
                  uVar9 = *(undefined8 *)((long)&(pAVar16->l).vx.field_0 + lVar53);
                  fVar76 = *(float *)((long)pAVar16 + lVar53 + -0x30) * *pfVar2;
                  local_1f8 = pfVar2[1] + (float)uVar9;
                  fVar79 = pfVar2[2] + (float)((ulong)uVar9 >> 0x20);
                  fVar96 = pfVar3[2] + *(float *)((long)&(pAVar16->l).vx.field_0 + lVar53 + 8);
                  fVar74 = pfVar3[1] * *(float *)((long)pAVar16 + lVar53 + -0x1c);
                  fVar84 = pfVar5[2] * *(float *)((long)pAVar16 + lVar53 + -8);
                  local_1b8[8] = 1;
                }
                else {
                  local_d8 = ZEXT416(*(uint *)((long)&(pAVar16->l).vx.field_0 + lVar53 + 0xc));
                  local_b8 = ZEXT416(*(uint *)((long)pAVar16 + lVar53 + -0x24));
                  local_e8 = ZEXT416(*(uint *)((long)pAVar16 + lVar53 + -4));
                  pfVar1 = (float *)((long)pAVar16 + lVar53 + -0x20);
                  local_f8 = *pfVar1;
                  fStack_f4 = pfVar1[1];
                  fStack_ec = pfVar1[3];
                  pfVar1 = (float *)((long)pAVar16 + lVar53 + -0x10);
                  local_108 = *pfVar1;
                  fStack_104 = pfVar1[1];
                  fStack_100 = pfVar1[2];
                  fStack_fc = pfVar1[3];
                  local_c8 = *(undefined8 *)((long)pAVar16 + lVar53 + -0x18);
                  uStack_c0 = 0;
                  pfVar1 = (float *)((long)pAVar16 + lVar53 + -0x30);
                  local_148.lower = *pfVar1;
                  fVar60 = pfVar1[1];
                  pfVar1 = (float *)(lVar15 + -0x30 + lVar53);
                  fVar88 = *pfVar1;
                  fVar103 = pfVar1[1];
                  fVar98 = pfVar1[2];
                  pfVar1 = (float *)(lVar15 + -0x20 + lVar53);
                  fVar80 = *pfVar1;
                  fVar82 = pfVar1[1];
                  fVar75 = pfVar1[2];
                  puVar4 = (undefined8 *)(lVar15 + -0x10 + lVar53);
                  local_118 = *puVar4;
                  uStack_110 = puVar4[1];
                  pfVar1 = (float *)(lVar15 + lVar53);
                  fVar83 = *pfVar1;
                  fVar67 = pfVar1[1];
                  fVar86 = pfVar1[2];
                  fVar76 = fVar88 * local_148.lower + fVar103 * local_f8 + fVar98 * local_108;
                  fVar74 = fVar88 * 0.0 + fVar103 * fStack_f4 + fVar98 * fStack_104;
                  fVar88 = fVar88 * 0.0 + fVar103 * 0.0 + fVar98 * fStack_100;
                  fStack_190 = fVar80 * 0.0 + fVar82 * 0.0 + fVar75 * fStack_100;
                  fStack_18c = fVar80 * fVar60 + fVar82 * fStack_ec + fVar75 * fStack_fc;
                  local_198 = (long *)CONCAT44(fVar80 * 0.0 +
                                               fVar82 * fStack_f4 + fVar75 * fStack_104,
                                               fVar80 * local_148.lower +
                                               fVar82 * local_f8 + fVar75 * local_108);
                  fStack_f0 = 0.0;
                  local_148.upper = 0.0;
                  lStack_140 = (ulong)(uint)fVar60 << 0x20;
                  pfVar1 = (float *)((long)&(pAVar16->l).vx.field_0 + lVar53);
                  local_a8 = fVar83 * local_148.lower + fVar67 * local_f8 + fVar86 * local_108 +
                             *pfVar1;
                  fStack_a4 = fVar83 * 0.0 + fVar67 * fStack_f4 + fVar86 * fStack_104 + pfVar1[1];
                  fStack_a0 = fVar83 * 0.0 + fVar67 * 0.0 + fVar86 * fStack_100 + pfVar1[2];
                  fStack_9c = fVar83 * fVar60 + fVar67 * fStack_ec + fVar86 * fStack_fc + pfVar1[3];
                  if ((((fVar74 != 0.0) || (NAN(fVar74))) ||
                      ((fVar88 != 0.0 || ((NAN(fVar88) || (fStack_190 != 0.0)))))) ||
                     (NAN(fStack_190))) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,
                               "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                               ,0x61);
                    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
                    std::ostream::put(' ');
                    std::ostream::flush();
                    uVar54 = extraout_RDX_09;
                  }
                  fVar80 = local_148.lower * (float)local_118 +
                           local_f8 * local_118._4_4_ + local_108 * (float)uStack_110;
                  fVar82 = local_148.upper * (float)local_118 +
                           fStack_f4 * local_118._4_4_ + fStack_104 * (float)uStack_110;
                  fVar84 = (float)lStack_140 * (float)local_118 +
                           fStack_f0 * local_118._4_4_ + fStack_100 * (float)uStack_110;
                  local_1b8[8] = 1;
                  fVar96 = (float)local_c8;
                  fVar98 = (float)((ulong)local_c8 >> 0x20);
                  fVar75 = (float)local_e8._0_4_;
                  fVar60 = (float)local_b8._0_4_;
                  fVar103 = local_a8;
                  fVar83 = fStack_a4;
                  fVar67 = fStack_a0;
                  fVar86 = (float)local_d8._0_4_;
                  fVar88 = (float)local_198;
                  fVar74 = local_198._4_4_;
                }
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                           ,0x67);
                std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
                std::ostream::put(' ');
                std::ostream::flush();
                fVar60 = *(float *)((long)&(pAVar16->l).vx.field_0 + lVar53 + 0xc);
                fVar79 = *(float *)((long)pAVar16 + lVar53 + -0x24);
                fVar88 = *(float *)((long)pAVar16 + lVar53 + -0x14);
                fVar103 = *(float *)((long)pAVar16 + lVar53 + -4);
                auVar115 = *(undefined1 (*) [16])((long)pAVar16 + lVar53 + -0x30);
                pfVar2 = (float *)((long)pAVar16 + lVar53 + -0x20);
                fVar98 = *pfVar2;
                fVar80 = pfVar2[1];
                pfVar1 = (float *)((long)pAVar16 + lVar53 + -0x10);
                fVar82 = *pfVar1;
                fVar75 = pfVar1[1];
                fVar83 = pfVar1[2];
                fVar105 = fVar79 * fVar88 + fVar60 * fVar103;
                fVar76 = fVar79 * fVar88 - fVar60 * fVar103;
                fVar96 = fVar60 * fVar60 + fVar79 * fVar79 + -fVar88 * fVar88 + -fVar103 * fVar103;
                fVar84 = fVar60 * fVar60 - fVar79 * fVar79;
                fVar104 = fVar88 * fVar88 + fVar84 + -fVar103 * fVar103;
                fVar113 = fVar79 * fVar103 - fVar60 * fVar88;
                fVar67 = fVar60 * fVar88 + fVar79 * fVar103;
                fVar110 = fVar88 * fVar103 + fVar60 * fVar79;
                fVar60 = fVar88 * fVar103 - fVar60 * fVar79;
                pfVar1 = (float *)((long)&(pAVar16->l).vx.field_0 + lVar53);
                fVar86 = *pfVar1;
                fVar74 = pfVar1[1];
                fVar8 = pfVar1[2];
                fVar105 = fVar105 + fVar105;
                fVar113 = fVar113 + fVar113;
                fVar76 = fVar76 + fVar76;
                fVar110 = fVar110 + fVar110;
                fVar67 = fVar67 + fVar67;
                fVar60 = fVar60 + fVar60;
                fVar79 = fVar103 * fVar103 + fVar84 + -fVar88 * fVar88;
                fVar92 = fVar96 * 1.0 + fVar105 * 0.0 + fVar113 * 0.0;
                fVar94 = fVar96 * 0.0 + fVar105 * 1.0 + fVar113 * 0.0;
                fVar97 = fVar96 * 0.0 + fVar105 * 0.0 + fVar113 * 1.0;
                fVar99 = fVar96 * 0.0 + fVar105 * 0.0 + fVar113 * 0.0;
                fVar87 = fVar76 * 1.0 + fVar104 * 0.0 + fVar110 * 0.0;
                fVar89 = fVar76 * 0.0 + fVar104 * 1.0 + fVar110 * 0.0;
                fVar90 = fVar76 * 0.0 + fVar104 * 0.0 + fVar110 * 1.0;
                fVar91 = fVar76 * 0.0 + fVar104 * 0.0 + fVar110 * 0.0;
                fVar110 = fVar67 * 1.0 + fVar60 * 0.0 + fVar79 * 0.0;
                fVar68 = fVar67 * 0.0 + fVar60 * 1.0 + fVar79 * 0.0;
                fVar70 = fVar67 * 0.0 + fVar60 * 0.0 + fVar79 * 1.0;
                fVar72 = fVar67 * 0.0 + fVar60 * 0.0 + fVar79 * 0.0;
                local_1e8 = auVar115._4_4_;
                fStack_1e4 = auVar115._8_4_;
                local_1f8 = auVar115._0_4_;
                fVar106 = local_1f8 * fVar92 + fVar87 * 0.0 + fVar110 * 0.0;
                fVar107 = local_1f8 * fVar94 + fVar89 * 0.0 + fVar68 * 0.0;
                fVar108 = local_1f8 * fVar97 + fVar90 * 0.0 + fVar70 * 0.0;
                fVar109 = local_1f8 * fVar99 + fVar91 * 0.0 + fVar72 * 0.0;
                fVar113 = fVar98 * fVar92 + fVar80 * fVar87 + fVar110 * 0.0;
                fVar69 = fVar98 * fVar94 + fVar80 * fVar89 + fVar68 * 0.0;
                fVar71 = fVar98 * fVar97 + fVar80 * fVar90 + fVar70 * 0.0;
                fVar73 = fVar98 * fVar99 + fVar80 * fVar91 + fVar72 * 0.0;
                fVar104 = fVar82 * fVar92 + fVar75 * fVar87 + fVar83 * fVar110;
                fVar105 = fVar82 * fVar94 + fVar75 * fVar89 + fVar83 * fVar68;
                fStack_190 = fVar82 * fVar97 + fVar75 * fVar90 + fVar83 * fVar70;
                fStack_18c = fVar82 * fVar99 + fVar75 * fVar91 + fVar83 * fVar72;
                local_198 = (long *)CONCAT44(fVar105,fVar104);
                fVar60 = *(float *)(lVar15 + 0xc + lVar53);
                fVar79 = *(float *)(lVar15 + -0x24 + lVar53);
                fVar88 = *(float *)(lVar15 + -0x14 + lVar53);
                fVar103 = *(float *)(lVar15 + -4 + lVar53);
                fVar84 = fVar79 * fVar88 + fVar60 * fVar103;
                fVar76 = fVar79 * fVar88 - fVar60 * fVar103;
                fVar96 = fVar60 * fVar60 + fVar79 * fVar79 + -fVar88 * fVar88 + -fVar103 * fVar103;
                fVar80 = fVar60 * fVar60 - fVar79 * fVar79;
                fVar112 = fVar88 * fVar88 + fVar80 + -fVar103 * fVar103;
                fVar111 = fVar79 * fVar103 - fVar60 * fVar88;
                fVar81 = fVar60 * fVar88 + fVar79 * fVar103;
                fVar114 = fVar88 * fVar103 + fVar60 * fVar79;
                fVar67 = fVar88 * fVar103 - fVar60 * fVar79;
                pfVar3 = (float *)(lVar15 + -0x30 + lVar53);
                fVar60 = *pfVar3;
                pfVar5 = (float *)(lVar15 + -0x20 + lVar53);
                fVar79 = *pfVar5;
                fVar98 = pfVar5[1];
                fVar100 = fVar103 * fVar103 + fVar80 + -fVar88 * fVar88;
                pfVar1 = (float *)(lVar15 + -0x10 + lVar53);
                fVar88 = *pfVar1;
                fVar103 = pfVar1[1];
                fVar80 = pfVar1[2];
                fVar84 = fVar84 + fVar84;
                fVar111 = fVar111 + fVar111;
                pfVar1 = (float *)(lVar15 + lVar53);
                fVar82 = *pfVar1;
                fVar75 = pfVar1[1];
                fVar83 = pfVar1[2];
                fVar77 = fVar96 * 1.0 + fVar84 * 0.0 + fVar111 * 0.0;
                fVar78 = fVar96 * 0.0 + fVar84 * 1.0 + fVar111 * 0.0;
                fVar111 = fVar96 * 0.0 + fVar84 * 0.0 + fVar111 * 1.0;
                fVar76 = fVar76 + fVar76;
                fVar114 = fVar114 + fVar114;
                fVar81 = fVar81 + fVar81;
                fVar67 = fVar67 + fVar67;
                fVar96 = fVar76 * 1.0 + fVar112 * 0.0 + fVar114 * 0.0;
                fVar84 = fVar76 * 0.0 + fVar112 * 1.0 + fVar114 * 0.0;
                fVar76 = fVar76 * 0.0 + fVar112 * 0.0 + fVar114 * 1.0;
                fVar112 = fVar81 * 1.0 + fVar67 * 0.0 + fVar100 * 0.0;
                fVar114 = fVar81 * 0.0 + fVar67 * 1.0 + fVar100 * 0.0;
                fVar67 = fVar81 * 0.0 + fVar67 * 0.0 + fVar100 * 1.0;
                fVar93 = fVar60 * fVar77 + fVar96 * 0.0 + fVar112 * 0.0;
                fVar95 = fVar60 * fVar78 + fVar84 * 0.0 + fVar114 * 0.0;
                fVar60 = fVar60 * fVar111 + fVar76 * 0.0 + fVar67 * 0.0;
                fVar81 = fVar79 * fVar77 + fVar98 * fVar96 + fVar112 * 0.0;
                fVar100 = fVar79 * fVar78 + fVar98 * fVar84 + fVar114 * 0.0;
                fVar85 = fVar79 * fVar111 + fVar98 * fVar76 + fVar67 * 0.0;
                fVar101 = fVar88 * fVar77 + fVar103 * fVar96 + fVar80 * fVar112;
                fVar102 = fVar88 * fVar78 + fVar103 * fVar84 + fVar80 * fVar114;
                fVar103 = fVar88 * fVar111 + fVar103 * fVar76 + fVar80 * fVar67;
                fVar88 = fVar82 * fVar77 + fVar75 * fVar96 + fVar83 * fVar112 + pfVar3[1] + 0.0;
                fVar77 = fVar82 * fVar78 + fVar75 * fVar84 + fVar83 * fVar114 + pfVar3[2] + 0.0;
                fVar78 = fVar82 * fVar111 + fVar75 * fVar76 + fVar83 * fVar67 + pfVar5[2] + 0.0;
                fVar76 = fVar93 * fVar106 + fVar95 * fVar113 + fVar60 * fVar104;
                local_1f8 = fVar93 * fVar107 + fVar95 * fVar69 + fVar60 * fVar105;
                fVar79 = fVar93 * fVar108 + fVar95 * fVar71 + fVar60 * fStack_190;
                fVar96 = fVar81 * fVar108 + fVar100 * fVar71 + fVar85 * fStack_190;
                fVar98 = fVar81 * fVar109 + fVar100 * fVar73 + fVar85 * fStack_18c;
                fVar80 = fVar101 * fVar106 + fVar102 * fVar113 + fVar103 * fVar104;
                fVar82 = fVar101 * fVar107 + fVar102 * fVar69 + fVar103 * fVar105;
                fVar84 = fVar101 * fVar108 + fVar102 * fVar71 + fVar103 * fStack_190;
                uVar54 = extraout_RDX_08;
                fVar75 = fVar101 * fVar109 + fVar102 * fVar73 + fVar103 * fStack_18c;
                fVar60 = fVar93 * fVar109 + fVar95 * fVar73 + fVar60 * fStack_18c;
                fVar103 = fVar88 * fVar106 + fVar77 * fVar113 + fVar78 * fVar104 +
                          fVar86 * fVar92 + fVar74 * fVar87 + fVar8 * fVar110 + local_1e8 + 0.0;
                fVar83 = fVar88 * fVar107 + fVar77 * fVar69 + fVar78 * fVar105 +
                         fVar86 * fVar94 + fVar74 * fVar89 + fVar8 * fVar68 + fStack_1e4 + 0.0;
                fVar67 = fVar88 * fVar108 + fVar77 * fVar71 + fVar78 * fStack_190 +
                         fVar86 * fVar97 + fVar74 * fVar90 + fVar8 * fVar70 + pfVar2[2] + 0.0;
                fVar86 = fVar88 * fVar109 + fVar77 * fVar73 + fVar78 * fStack_18c +
                         fVar86 * fVar99 + fVar74 * fVar91 + fVar8 * fVar72 + 0.0;
                fVar88 = fVar81 * fVar106 + fVar100 * fVar113 + fVar85 * fVar104;
                fVar74 = fVar81 * fVar107 + fVar100 * fVar69 + fVar85 * fVar105;
              }
            }
            else {
              pfVar1 = (float *)((long)pAVar16 + lVar53 + -0x24);
              auVar29._4_4_ = -(uint)(pfVar1[1] != 0.0);
              auVar29._0_4_ = -(uint)(*pfVar1 != 0.0);
              auVar29._8_4_ = -(uint)(pfVar1[2] != 1.0);
              auVar29._12_4_ = -(uint)(pfVar1[3] != 0.0);
              uVar56 = movmskps(uVar56,auVar29);
              if ((((bVar11 & (byte)uVar56) != 0) || ((uVar56 & 2) != 0)) ||
                 (((uVar56 & 4) != 0 ||
                  (bVar52 = ((byte)uVar56 & 8) >> 3, uVar56 = CONCAT31((int3)(uVar56 >> 8),bVar52),
                  bVar52 != 0)))) goto LAB_0015fe13;
              pfVar1 = (float *)((long)pAVar16 + lVar53 + -0x14);
              auVar30._4_4_ = -(uint)(pfVar1[1] != 0.0);
              auVar30._0_4_ = -(uint)(*pfVar1 != 0.0);
              auVar30._8_4_ = -(uint)(pfVar1[2] != 0.0);
              auVar30._12_4_ = -(uint)(pfVar1[3] != 1.0);
              uVar56 = movmskps(uVar56,auVar30);
              if (((((bVar11 & (byte)uVar56) != 0) || ((uVar56 & 2) != 0)) || ((uVar56 & 4) != 0))
                 || (bVar52 = ((byte)uVar56 & 8) >> 3, uVar56 = CONCAT31((int3)(uVar56 >> 8),bVar52)
                    , bVar52 != 0)) goto LAB_0015fe13;
              pfVar1 = (float *)((long)pAVar16 + lVar53 + -4);
              auVar31._4_4_ = -(uint)(pfVar1[1] != 0.0);
              auVar31._0_4_ = -(uint)(*pfVar1 != 0.0);
              auVar31._8_4_ = -(uint)(pfVar1[2] != 0.0);
              auVar31._12_4_ = -(uint)(pfVar1[3] != 0.0);
              uVar56 = movmskps(uVar56,auVar31);
              if ((((bVar11 & (byte)uVar56) != 0) || ((uVar56 & 2) != 0)) || ((uVar56 & 4) != 0))
              goto LAB_0015fe13;
              bVar52 = ((byte)uVar56 & 8) >> 3;
              uVar56 = CONCAT31((int3)(uVar56 >> 8),bVar52);
              uVar54 = (ulong)uVar56;
              if ((bVar52 != 0) ||
                 ((bVar11 != false &&
                  ((fVar60 = *(float *)((long)&(pAVar16->l).vx.field_0 + lVar53 + 0xc),
                   fVar60 != 1.0 || (NAN(fVar60))))))) goto LAB_0015fe13;
              local_1b8[8] = bVar12;
              pfVar1 = (float *)(lVar15 + -0x30 + lVar53);
              fVar76 = *pfVar1;
              local_1f8 = pfVar1[1];
              fVar79 = pfVar1[2];
              fVar60 = pfVar1[3];
              pfVar1 = (float *)(lVar15 + -0x20 + lVar53);
              fVar88 = *pfVar1;
              fVar74 = pfVar1[1];
              fVar96 = pfVar1[2];
              fVar98 = pfVar1[3];
              pfVar1 = (float *)(lVar15 + -0x10 + lVar53);
              fVar80 = *pfVar1;
              fVar82 = pfVar1[1];
              fVar84 = pfVar1[2];
              fVar75 = pfVar1[3];
              pfVar1 = (float *)(lVar15 + lVar53);
              fVar103 = *pfVar1;
              fVar83 = pfVar1[1];
              fVar67 = pfVar1[2];
              fVar86 = pfVar1[3];
            }
LAB_0016090f:
            pfVar1 = (float *)((long)&((Vector *)(local_1b8._0_8_ + -0x30))->field_0 + lVar53);
            *pfVar1 = fVar76;
            pfVar1[1] = local_1f8;
            pfVar1[2] = fVar79;
            pfVar1[3] = fVar60;
            pfVar1 = (float *)((long)&((Vector *)(local_1b8._0_8_ + -0x20))->field_0 + lVar53);
            *pfVar1 = fVar88;
            pfVar1[1] = fVar74;
            pfVar1[2] = fVar96;
            pfVar1[3] = fVar98;
            pfVar1 = (float *)((long)&((Vector *)(local_1b8._0_8_ + -0x10))->field_0 + lVar53);
            *pfVar1 = fVar80;
            pfVar1[1] = fVar82;
            pfVar1[2] = fVar84;
            pfVar1[3] = fVar75;
            pfVar1 = (float *)(local_1b8._0_8_ + lVar53);
            *pfVar1 = fVar103;
            pfVar1[1] = fVar83;
            pfVar1[2] = fVar67;
            pfVar1[3] = fVar86;
            uVar55 = uVar55 + 1;
            lVar53 = lVar53 + 0x40;
            pAVar48 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)local_1b8._0_8_;
          } while (uVar55 < (spaces->spaces).size_active);
        }
      }
      convertLightsAndCameras
                (local_128,
                 (vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                  *)local_130,(Ref<embree::SceneGraph::Node> *)(plVar46 + 0x13),
                 (Transformations *)local_1d8);
      alignedFree((void *)local_1b8._0_8_);
    }
    if (plVar46 != (long *)0x0) {
      (**(code **)(*plVar46 + 0x18))(plVar46);
    }
  }
  return;
}

Assistant:

void convertLightsAndCameras(std::vector<Ref<SceneGraph::Node>>& group, const Ref<SceneGraph::Node>& node, const SceneGraph::Transformations& spaces)
    {
      if (!node->hasLightOrCamera) return;
      
      if (Ref<SceneGraph::TransformNode> xfmNode = node.dynamicCast<SceneGraph::TransformNode>()) {
        convertLightsAndCameras(group,xfmNode->child, spaces*xfmNode->spaces);
      } 
      else if (Ref<SceneGraph::GroupNode> groupNode = node.dynamicCast<SceneGraph::GroupNode>()) {
        for (const auto& child : groupNode->children) convertLightsAndCameras(group,child,spaces);
      }
      else if (Ref<SceneGraph::AnimatedLightNode> lightNode = node.dynamicCast<SceneGraph::AnimatedLightNode>()) {
        if (spaces.size() != 1) throw std::runtime_error("animated lights cannot get instantiated with a transform animation");
        group.push_back(lightNode->transform(spaces[0]).dynamicCast<SceneGraph::Node>());
      }
      else if (Ref<SceneGraph::LightNode> lightNode = node.dynamicCast<SceneGraph::LightNode>())
      {
        if (spaces.size() == 1)
          group.push_back(lightNode->transform(spaces[0]).dynamicCast<SceneGraph::Node>());
        else
        {
          std::vector<Ref<SceneGraph::LightNode>> lights(spaces.size());
          for (size_t i=0; i<spaces.size(); i++)
            lights[i] = lightNode->transform(spaces[i]);
          
          group.push_back(new SceneGraph::AnimatedLightNode(std::move(lights),spaces.time_range));
        }
      }
      else if (Ref<SceneGraph::AnimatedPerspectiveCameraNode> cameraNode = node.dynamicCast<SceneGraph::AnimatedPerspectiveCameraNode>())
      {
        if (spaces.size() != 1) throw std::runtime_error("animated cameras cannot get instantiated with a transform animation");
        group.push_back(new SceneGraph::AnimatedPerspectiveCameraNode(cameraNode,spaces[0],makeUniqueID(cameraNode->name)));
      }
      else if (Ref<SceneGraph::PerspectiveCameraNode> cameraNode = node.dynamicCast<SceneGraph::PerspectiveCameraNode>())
      {
        if (spaces.size() == 1)
          group.push_back(new SceneGraph::PerspectiveCameraNode(cameraNode,spaces[0],makeUniqueID(cameraNode->name)));
        else
        {
          std::vector<Ref<SceneGraph::PerspectiveCameraNode>> cameras(spaces.size());
          for (size_t i=0; i<spaces.size(); i++)
            cameras[i] = new SceneGraph::PerspectiveCameraNode(cameraNode,spaces[i]);
          
          group.push_back(new SceneGraph::AnimatedPerspectiveCameraNode(std::move(cameras),spaces.time_range,makeUniqueID(cameraNode->name)));
        }
      }
    }